

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx2::CurveNiMBIntersectorK<8,8>::
     intersect_t<embree::avx2::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  Primitive PVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  RTCRayQueryContext *pRVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int iVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [12];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  int iVar99;
  uint uVar100;
  uint uVar101;
  ulong uVar102;
  ulong uVar103;
  uint uVar104;
  long lVar105;
  long lVar106;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  uint uVar107;
  bool bVar108;
  float fVar109;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined8 uVar112;
  float fVar146;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar113 [16];
  undefined4 uVar110;
  float fVar111;
  float fVar145;
  float fVar147;
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar114 [16];
  undefined1 auVar137 [32];
  undefined1 auVar159 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar152 [16];
  undefined4 uVar151;
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [64];
  undefined1 auVar170 [16];
  float fVar169;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar168;
  float fVar188;
  float fVar189;
  undefined1 auVar181 [32];
  float fVar190;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  float fVar191;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar212 [16];
  float fVar211;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  float fVar232;
  float fVar233;
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar234;
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [64];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  undefined1 auVar244 [16];
  float fVar251;
  float fVar253;
  float fVar254;
  float fVar255;
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar252;
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar271 [16];
  undefined1 auVar260 [32];
  float fVar262;
  float fVar263;
  float fVar264;
  undefined1 auVar261 [64];
  undefined1 auVar265 [16];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  float fVar270;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [28];
  float fVar282;
  float fVar283;
  float fVar285;
  float fVar286;
  undefined1 auVar275 [32];
  float fVar284;
  float fVar287;
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [64];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  float fVar293;
  float fVar294;
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [64];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar303 [16];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [28];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint uStack_c24;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  RTCFilterFunctionNArguments local_bd0;
  undefined1 local_ba0 [32];
  undefined1 (*local_b70) [32];
  ulong local_b68;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  undefined1 auStack_b50 [16];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [16];
  undefined1 local_ad0 [16];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [16];
  Primitive *local_a30;
  ulong local_a28;
  undefined1 local_a20 [32];
  undefined1 local_a00 [8];
  float fStack_9f8;
  float fStack_9f4;
  float fStack_9f0;
  float fStack_9ec;
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  float fStack_9d0;
  float fStack_9cc;
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  undefined4 uStack_964;
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [32];
  uint local_780;
  uint uStack_77c;
  uint uStack_778;
  uint uStack_774;
  uint uStack_770;
  uint uStack_76c;
  uint uStack_768;
  uint uStack_764;
  uint local_760;
  uint uStack_75c;
  uint uStack_758;
  uint uStack_754;
  uint uStack_750;
  uint uStack_74c;
  uint uStack_748;
  uint uStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined4 local_700;
  undefined4 uStack_6fc;
  undefined4 uStack_6f8;
  undefined4 uStack_6f4;
  undefined4 uStack_6f0;
  undefined4 uStack_6ec;
  undefined4 uStack_6e8;
  undefined4 uStack_6e4;
  undefined4 local_6e0;
  undefined4 uStack_6dc;
  undefined4 uStack_6d8;
  undefined4 uStack_6d4;
  undefined4 uStack_6d0;
  undefined4 uStack_6cc;
  undefined4 uStack_6c8;
  undefined4 uStack_6c4;
  undefined4 local_6c0;
  undefined4 uStack_6bc;
  undefined4 uStack_6b8;
  undefined4 uStack_6b4;
  undefined4 uStack_6b0;
  undefined4 uStack_6ac;
  undefined4 uStack_6a8;
  undefined4 uStack_6a4;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  undefined4 uStack_4f0;
  undefined4 uStack_4ec;
  undefined4 uStack_4e8;
  undefined4 uStack_4e4;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [32];
  uint local_460;
  uint uStack_45c;
  uint uStack_458;
  uint uStack_454;
  uint uStack_450;
  uint uStack_44c;
  uint uStack_448;
  uint uStack_444;
  uint local_440;
  uint uStack_43c;
  uint uStack_438;
  uint uStack_434;
  uint uStack_430;
  uint uStack_42c;
  uint uStack_428;
  uint uStack_424;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined4 uStack_388;
  undefined4 uStack_384;
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  undefined4 uStack_370;
  undefined4 uStack_36c;
  undefined4 uStack_368;
  undefined4 uStack_364;
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar302 [64];
  undefined1 auVar306 [64];
  
  PVar8 = prim[1];
  uVar102 = (ulong)(byte)PVar8;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar102 * 4 + 6);
  auVar159 = vpmovsxbd_avx2(auVar2);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar102 * 5 + 6);
  auVar125 = vpmovsxbd_avx2(auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar102 * 6 + 6);
  auVar187 = vpmovsxbd_avx2(auVar4);
  auVar271._8_8_ = 0;
  auVar271._0_8_ = *(ulong *)(prim + uVar102 * 0xf + 6);
  auVar16 = vpmovsxbd_avx2(auVar271);
  lVar105 = uVar102 * 0x25;
  auVar158._1_3_ = 0;
  auVar158[0] = PVar8;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar17 = vpmovsxbd_avx2(auVar5);
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar102 * 0x11 + 6);
  auVar129 = vpmovsxbd_avx2(auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + uVar102 * 0x1a + 6);
  auVar124 = vpmovsxbd_avx2(auVar7);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *(ulong *)(prim + uVar102 * 0x1b + 6);
  auVar259 = vpmovsxbd_avx2(auVar116);
  auVar308._8_8_ = 0;
  auVar308._0_8_ = *(ulong *)(prim + uVar102 * 0x1c + 6);
  auVar18 = vpmovsxbd_avx2(auVar308);
  auVar2 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar2 = vinsertps_avx(auVar2,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar3 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  fVar109 = *(float *)(prim + lVar105 + 0x12);
  auVar4 = vsubps_avx(auVar2,*(undefined1 (*) [16])(prim + lVar105 + 6));
  fVar168 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar105 + 0x16)) *
            *(float *)(prim + lVar105 + 0x1a);
  auVar2 = vinsertps_avx(auVar3,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar265._0_4_ = fVar109 * auVar4._0_4_;
  auVar265._4_4_ = fVar109 * auVar4._4_4_;
  auVar265._8_4_ = fVar109 * auVar4._8_4_;
  auVar265._12_4_ = fVar109 * auVar4._12_4_;
  auVar295._0_4_ = fVar109 * auVar2._0_4_;
  auVar295._4_4_ = fVar109 * auVar2._4_4_;
  auVar295._8_4_ = fVar109 * auVar2._8_4_;
  auVar295._12_4_ = fVar109 * auVar2._12_4_;
  auVar125 = vcvtdq2ps_avx(auVar125);
  auVar187 = vcvtdq2ps_avx(auVar187);
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar15 = vcvtdq2ps_avx(auVar259);
  auVar134 = vcvtdq2ps_avx(auVar18);
  auVar2 = vmovshdup_avx(auVar295);
  auVar221._0_8_ = auVar2._0_8_;
  auVar221._8_8_ = auVar221._0_8_;
  auVar221._16_8_ = auVar221._0_8_;
  auVar221._24_8_ = auVar221._0_8_;
  auVar2 = vshufps_avx(auVar295,auVar295,0xaa);
  fVar109 = auVar2._0_4_;
  fVar211 = auVar2._4_4_;
  auVar19._4_4_ = fVar211 * auVar187._4_4_;
  auVar19._0_4_ = fVar109 * auVar187._0_4_;
  auVar19._8_4_ = fVar109 * auVar187._8_4_;
  auVar19._12_4_ = fVar211 * auVar187._12_4_;
  auVar19._16_4_ = fVar109 * auVar187._16_4_;
  auVar19._20_4_ = fVar211 * auVar187._20_4_;
  auVar19._24_4_ = fVar109 * auVar187._24_4_;
  auVar19._28_4_ = auVar18._28_4_;
  auVar18._4_4_ = fVar211 * auVar129._4_4_;
  auVar18._0_4_ = fVar109 * auVar129._0_4_;
  auVar18._8_4_ = fVar109 * auVar129._8_4_;
  auVar18._12_4_ = fVar211 * auVar129._12_4_;
  auVar18._16_4_ = fVar109 * auVar129._16_4_;
  auVar18._20_4_ = fVar211 * auVar129._20_4_;
  auVar18._24_4_ = fVar109 * auVar129._24_4_;
  auVar18._28_4_ = auVar259._28_4_;
  auVar259._4_4_ = auVar134._4_4_ * fVar211;
  auVar259._0_4_ = auVar134._0_4_ * fVar109;
  auVar259._8_4_ = auVar134._8_4_ * fVar109;
  auVar259._12_4_ = auVar134._12_4_ * fVar211;
  auVar259._16_4_ = auVar134._16_4_ * fVar109;
  auVar259._20_4_ = auVar134._20_4_ * fVar211;
  auVar259._24_4_ = auVar134._24_4_ * fVar109;
  auVar259._28_4_ = fVar211;
  auVar3 = vfmadd231ps_fma(auVar19,auVar221,auVar125);
  auVar4 = vfmadd231ps_fma(auVar18,auVar221,auVar17);
  auVar271 = vfmadd231ps_fma(auVar259,auVar15,auVar221);
  auVar2 = vshufps_avx(auVar265,auVar265,0xaa);
  fVar109 = auVar2._0_4_;
  auVar222._0_4_ = fVar109 * auVar187._0_4_;
  fVar211 = auVar2._4_4_;
  auVar222._4_4_ = fVar211 * auVar187._4_4_;
  auVar222._8_4_ = fVar109 * auVar187._8_4_;
  auVar222._12_4_ = fVar211 * auVar187._12_4_;
  auVar222._16_4_ = fVar109 * auVar187._16_4_;
  auVar222._20_4_ = fVar211 * auVar187._20_4_;
  auVar222._24_4_ = fVar109 * auVar187._24_4_;
  auVar222._28_4_ = 0;
  auVar127._4_4_ = fVar211 * auVar129._4_4_;
  auVar127._0_4_ = fVar109 * auVar129._0_4_;
  auVar127._8_4_ = fVar109 * auVar129._8_4_;
  auVar127._12_4_ = fVar211 * auVar129._12_4_;
  auVar127._16_4_ = fVar109 * auVar129._16_4_;
  auVar127._20_4_ = fVar211 * auVar129._20_4_;
  auVar127._24_4_ = fVar109 * auVar129._24_4_;
  auVar127._28_4_ = auVar187._28_4_;
  auVar187._4_4_ = auVar134._4_4_ * fVar211;
  auVar187._0_4_ = auVar134._0_4_ * fVar109;
  auVar187._8_4_ = auVar134._8_4_ * fVar109;
  auVar187._12_4_ = auVar134._12_4_ * fVar211;
  auVar187._16_4_ = auVar134._16_4_ * fVar109;
  auVar187._20_4_ = auVar134._20_4_ * fVar211;
  auVar187._24_4_ = auVar134._24_4_ * fVar109;
  auVar187._28_4_ = auVar134._28_4_;
  auVar2 = vmovshdup_avx(auVar265);
  auVar130._0_8_ = auVar2._0_8_;
  auVar130._8_8_ = auVar130._0_8_;
  auVar130._16_8_ = auVar130._0_8_;
  auVar130._24_8_ = auVar130._0_8_;
  auVar2 = vfmadd231ps_fma(auVar222,auVar130,auVar125);
  local_aa0 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 7 + 6));
  auVar5 = vfmadd231ps_fma(auVar127,auVar130,auVar17);
  auVar129 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0xb + 6));
  auVar6 = vfmadd231ps_fma(auVar187,auVar130,auVar15);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 9 + 6));
  auVar134 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0xd + 6));
  auVar125 = vcvtdq2ps_avx(auVar159);
  auVar187 = vcvtdq2ps_avx(auVar16);
  auVar17 = vcvtdq2ps_avx(auVar124);
  auVar297._4_4_ = auVar295._0_4_;
  auVar297._0_4_ = auVar295._0_4_;
  auVar297._8_4_ = auVar295._0_4_;
  auVar297._12_4_ = auVar295._0_4_;
  auVar297._16_4_ = auVar295._0_4_;
  auVar297._20_4_ = auVar295._0_4_;
  auVar297._24_4_ = auVar295._0_4_;
  auVar297._28_4_ = auVar295._0_4_;
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar297,auVar125);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar297,auVar187);
  auVar295 = vfmadd231ps_fma(ZEXT1632(auVar271),auVar17,auVar297);
  auVar159 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0x12 + 6));
  auVar266._4_4_ = auVar265._0_4_;
  auVar266._0_4_ = auVar265._0_4_;
  auVar266._8_4_ = auVar265._0_4_;
  auVar266._12_4_ = auVar265._0_4_;
  auVar266._16_4_ = auVar265._0_4_;
  auVar266._20_4_ = auVar265._0_4_;
  auVar266._24_4_ = auVar265._0_4_;
  auVar266._28_4_ = auVar265._0_4_;
  auVar265 = vfmadd231ps_fma(ZEXT1632(auVar2),auVar266,auVar125);
  auVar16 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0x16 + 6));
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar266,auVar187);
  local_b40 = ZEXT1632(auVar2);
  auVar113 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar266,auVar17);
  local_8c0._8_4_ = 0x7fffffff;
  local_8c0._0_8_ = 0x7fffffff7fffffff;
  local_8c0._12_4_ = 0x7fffffff;
  local_8c0._16_4_ = 0x7fffffff;
  local_8c0._20_4_ = 0x7fffffff;
  local_8c0._24_4_ = 0x7fffffff;
  local_8c0._28_4_ = 0x7fffffff;
  auVar125 = vandps_avx(ZEXT1632(auVar3),local_8c0);
  auVar207._8_4_ = 0x219392ef;
  auVar207._0_8_ = 0x219392ef219392ef;
  auVar207._12_4_ = 0x219392ef;
  auVar207._16_4_ = 0x219392ef;
  auVar207._20_4_ = 0x219392ef;
  auVar207._24_4_ = 0x219392ef;
  auVar207._28_4_ = 0x219392ef;
  auVar125 = vcmpps_avx(auVar125,auVar207,1);
  auVar187 = vblendvps_avx(ZEXT1632(auVar3),auVar207,auVar125);
  auVar125 = vandps_avx(ZEXT1632(auVar4),local_8c0);
  auVar125 = vcmpps_avx(auVar125,auVar207,1);
  auVar17 = vblendvps_avx(ZEXT1632(auVar4),auVar207,auVar125);
  auVar245._4_4_ = fVar168;
  auVar245._0_4_ = fVar168;
  auVar245._8_4_ = fVar168;
  auVar245._12_4_ = fVar168;
  auVar245._16_4_ = fVar168;
  auVar245._20_4_ = fVar168;
  auVar245._24_4_ = fVar168;
  auVar245._28_4_ = fVar168;
  auVar125 = vcvtdq2ps_avx(local_aa0);
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar129 = vsubps_avx(auVar129,auVar125);
  auVar271 = vfmadd213ps_fma(auVar129,auVar245,auVar125);
  auVar125 = vcvtdq2ps_avx(auVar15);
  auVar129 = vcvtdq2ps_avx(auVar134);
  auVar129 = vsubps_avx(auVar129,auVar125);
  auVar5 = vfmadd213ps_fma(auVar129,auVar245,auVar125);
  auVar125 = vcvtdq2ps_avx(auVar159);
  auVar129 = vcvtdq2ps_avx(auVar16);
  auVar129 = vsubps_avx(auVar129,auVar125);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0x14 + 6));
  auVar6 = vfmadd213ps_fma(auVar129,auVar245,auVar125);
  auVar125 = vcvtdq2ps_avx(auVar15);
  auVar129 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0x18 + 6));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar129 = vsubps_avx(auVar129,auVar125);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0x1d + 6));
  auVar7 = vfmadd213ps_fma(auVar129,auVar245,auVar125);
  auVar125 = vcvtdq2ps_avx(auVar15);
  auVar129 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0x21 + 6));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar129 = vsubps_avx(auVar129,auVar125);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0x1f + 6));
  auVar116 = vfmadd213ps_fma(auVar129,auVar245,auVar125);
  auVar125 = vcvtdq2ps_avx(auVar15);
  auVar129 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar102 * 0x23 + 6));
  auVar129 = vcvtdq2ps_avx(auVar129);
  auVar129 = vsubps_avx(auVar129,auVar125);
  auVar308 = vfmadd213ps_fma(auVar129,auVar245,auVar125);
  auVar125 = vandps_avx(ZEXT1632(auVar295),local_8c0);
  auVar125 = vcmpps_avx(auVar125,auVar207,1);
  auVar129 = vrcpps_avx(auVar187);
  auVar125 = vblendvps_avx(ZEXT1632(auVar295),auVar207,auVar125);
  auVar157._8_4_ = 0x3f800000;
  auVar157._0_8_ = 0x3f8000003f800000;
  auVar157._12_4_ = 0x3f800000;
  auVar157._16_4_ = 0x3f800000;
  auVar157._20_4_ = 0x3f800000;
  auVar157._24_4_ = 0x3f800000;
  auVar157._28_4_ = 0x3f800000;
  auVar2 = vfnmadd213ps_fma(auVar187,auVar129,auVar157);
  auVar187 = vrcpps_avx(auVar17);
  auVar2 = vfmadd132ps_fma(ZEXT1632(auVar2),auVar129,auVar129);
  auVar129 = vrcpps_avx(auVar125);
  auVar3 = vfnmadd213ps_fma(auVar17,auVar187,auVar157);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar187,auVar187);
  auVar4 = vfnmadd213ps_fma(auVar125,auVar129,auVar157);
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar129,auVar129);
  auVar125 = vsubps_avx(ZEXT1632(auVar271),ZEXT1632(auVar265));
  auVar17._4_4_ = auVar2._4_4_ * auVar125._4_4_;
  auVar17._0_4_ = auVar2._0_4_ * auVar125._0_4_;
  auVar17._8_4_ = auVar2._8_4_ * auVar125._8_4_;
  auVar17._12_4_ = auVar2._12_4_ * auVar125._12_4_;
  auVar17._16_4_ = auVar125._16_4_ * 0.0;
  auVar17._20_4_ = auVar125._20_4_ * 0.0;
  auVar17._24_4_ = auVar125._24_4_ * 0.0;
  auVar17._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar265));
  auVar129._4_4_ = auVar2._4_4_ * auVar125._4_4_;
  auVar129._0_4_ = auVar2._0_4_ * auVar125._0_4_;
  auVar129._8_4_ = auVar2._8_4_ * auVar125._8_4_;
  auVar129._12_4_ = auVar2._12_4_ * auVar125._12_4_;
  auVar129._16_4_ = auVar125._16_4_ * 0.0;
  auVar129._20_4_ = auVar125._20_4_ * 0.0;
  auVar129._24_4_ = auVar125._24_4_ * 0.0;
  auVar129._28_4_ = 0x3f800000;
  auVar125 = vsubps_avx(ZEXT1632(auVar6),local_b40);
  auVar15._4_4_ = auVar3._4_4_ * auVar125._4_4_;
  auVar15._0_4_ = auVar3._0_4_ * auVar125._0_4_;
  auVar15._8_4_ = auVar3._8_4_ * auVar125._8_4_;
  auVar15._12_4_ = auVar3._12_4_ * auVar125._12_4_;
  auVar15._16_4_ = auVar125._16_4_ * 0.0;
  auVar15._20_4_ = auVar125._20_4_ * 0.0;
  auVar15._24_4_ = auVar125._24_4_ * 0.0;
  auVar15._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(ZEXT1632(auVar7),local_b40);
  auVar124._0_4_ = auVar3._0_4_ * auVar125._0_4_;
  auVar124._4_4_ = auVar3._4_4_ * auVar125._4_4_;
  auVar124._8_4_ = auVar3._8_4_ * auVar125._8_4_;
  auVar124._12_4_ = auVar3._12_4_ * auVar125._12_4_;
  auVar124._16_4_ = auVar125._16_4_ * 0.0;
  auVar124._20_4_ = auVar125._20_4_ * 0.0;
  auVar124._24_4_ = auVar125._24_4_ * 0.0;
  auVar124._28_4_ = 0;
  auVar125 = vsubps_avx(ZEXT1632(auVar116),ZEXT1632(auVar113));
  auVar134._4_4_ = auVar4._4_4_ * auVar125._4_4_;
  auVar134._0_4_ = auVar4._0_4_ * auVar125._0_4_;
  auVar134._8_4_ = auVar4._8_4_ * auVar125._8_4_;
  auVar134._12_4_ = auVar4._12_4_ * auVar125._12_4_;
  auVar134._16_4_ = auVar125._16_4_ * 0.0;
  auVar134._20_4_ = auVar125._20_4_ * 0.0;
  auVar134._24_4_ = auVar125._24_4_ * 0.0;
  auVar134._28_4_ = auVar125._28_4_;
  auVar125 = vsubps_avx(ZEXT1632(auVar308),ZEXT1632(auVar113));
  auVar159._4_4_ = auVar4._4_4_ * auVar125._4_4_;
  auVar159._0_4_ = auVar4._0_4_ * auVar125._0_4_;
  auVar159._8_4_ = auVar4._8_4_ * auVar125._8_4_;
  auVar159._12_4_ = auVar4._12_4_ * auVar125._12_4_;
  auVar159._16_4_ = auVar125._16_4_ * 0.0;
  auVar159._20_4_ = auVar125._20_4_ * 0.0;
  auVar159._24_4_ = auVar125._24_4_ * 0.0;
  auVar159._28_4_ = auVar125._28_4_;
  auVar125 = vpminsd_avx2(auVar17,auVar129);
  auVar187 = vpminsd_avx2(auVar15,auVar124);
  auVar125 = vmaxps_avx(auVar125,auVar187);
  auVar187 = vpminsd_avx2(auVar134,auVar159);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar275._4_4_ = uVar110;
  auVar275._0_4_ = uVar110;
  auVar275._8_4_ = uVar110;
  auVar275._12_4_ = uVar110;
  auVar275._16_4_ = uVar110;
  auVar275._20_4_ = uVar110;
  auVar275._24_4_ = uVar110;
  auVar275._28_4_ = uVar110;
  auVar187 = vmaxps_avx(auVar187,auVar275);
  auVar125 = vmaxps_avx(auVar125,auVar187);
  local_360._4_4_ = auVar125._4_4_ * 0.99999964;
  local_360._0_4_ = auVar125._0_4_ * 0.99999964;
  local_360._8_4_ = auVar125._8_4_ * 0.99999964;
  local_360._12_4_ = auVar125._12_4_ * 0.99999964;
  local_360._16_4_ = auVar125._16_4_ * 0.99999964;
  local_360._20_4_ = auVar125._20_4_ * 0.99999964;
  local_360._24_4_ = auVar125._24_4_ * 0.99999964;
  local_360._28_4_ = auVar125._28_4_;
  auVar125 = vpmaxsd_avx2(auVar17,auVar129);
  auVar187 = vpmaxsd_avx2(auVar15,auVar124);
  auVar125 = vminps_avx(auVar125,auVar187);
  auVar187 = vpmaxsd_avx2(auVar134,auVar159);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar181._4_4_ = uVar110;
  auVar181._0_4_ = uVar110;
  auVar181._8_4_ = uVar110;
  auVar181._12_4_ = uVar110;
  auVar181._16_4_ = uVar110;
  auVar181._20_4_ = uVar110;
  auVar181._24_4_ = uVar110;
  auVar181._28_4_ = uVar110;
  auVar187 = vminps_avx(auVar187,auVar181);
  auVar125 = vminps_avx(auVar125,auVar187);
  auVar16._4_4_ = auVar125._4_4_ * 1.0000004;
  auVar16._0_4_ = auVar125._0_4_ * 1.0000004;
  auVar16._8_4_ = auVar125._8_4_ * 1.0000004;
  auVar16._12_4_ = auVar125._12_4_ * 1.0000004;
  auVar16._16_4_ = auVar125._16_4_ * 1.0000004;
  auVar16._20_4_ = auVar125._20_4_ * 1.0000004;
  auVar16._24_4_ = auVar125._24_4_ * 1.0000004;
  auVar16._28_4_ = auVar125._28_4_;
  auVar158[4] = PVar8;
  auVar158._5_3_ = 0;
  auVar158[8] = PVar8;
  auVar158._9_3_ = 0;
  auVar158[0xc] = PVar8;
  auVar158._13_3_ = 0;
  auVar158[0x10] = PVar8;
  auVar158._17_3_ = 0;
  auVar158[0x14] = PVar8;
  auVar158._21_3_ = 0;
  auVar158[0x18] = PVar8;
  auVar158._25_3_ = 0;
  auVar158[0x1c] = PVar8;
  auVar158._29_3_ = 0;
  auVar125 = vcmpps_avx(local_360,auVar16,2);
  auVar187 = vpcmpgtd_avx2(auVar158,_DAT_01fb4ba0);
  auVar125 = vandps_avx(auVar125,auVar187);
  uVar104 = vmovmskps_avx(auVar125);
  auVar125._16_16_ = mm_lookupmask_ps._240_16_;
  auVar125._0_16_ = mm_lookupmask_ps._240_16_;
  local_860 = vblendps_avx(auVar125,ZEXT832(0) << 0x20,0x80);
  local_b70 = (undefined1 (*) [32])&local_460;
  iVar99 = 1 << ((uint)k & 0x1f);
  auVar126._4_4_ = iVar99;
  auVar126._0_4_ = iVar99;
  auVar126._8_4_ = iVar99;
  auVar126._12_4_ = iVar99;
  auVar126._16_4_ = iVar99;
  auVar126._20_4_ = iVar99;
  auVar126._24_4_ = iVar99;
  auVar126._28_4_ = iVar99;
  auVar187 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar125 = vpand_avx2(auVar126,auVar187);
  local_7a0 = vpcmpeqd_avx2(auVar125,auVar187);
  auVar281 = ZEXT3264(_DAT_01f7b040);
  local_a30 = prim;
LAB_013fd2c6:
  local_a28 = (ulong)uVar104;
  if (local_a28 == 0) {
    return;
  }
  lVar105 = 0;
  for (uVar102 = local_a28; (uVar102 & 1) == 0; uVar102 = uVar102 >> 1 | 0x8000000000000000) {
    lVar105 = lVar105 + 1;
  }
  uVar104 = *(uint *)(local_a30 + 2);
  local_780 = *(uint *)(local_a30 + lVar105 * 4 + 6);
  local_b68 = (ulong)local_780;
  pGVar9 = (context->scene->geometries).items[uVar104].ptr;
  uVar102 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                            local_b68 *
                            pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar109 = (pGVar9->time_range).lower;
  fVar109 = pGVar9->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar109) / ((pGVar9->time_range).upper - fVar109));
  auVar2 = vroundss_avx(ZEXT416((uint)fVar109),ZEXT416((uint)fVar109),9);
  auVar2 = vminss_avx(auVar2,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar2 = vmaxss_avx(ZEXT816(0) << 0x20,auVar2);
  fVar109 = fVar109 - auVar2._0_4_;
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar106 = (long)(int)auVar2._0_4_ * 0x38;
  lVar105 = *(long *)(_Var10 + 0x10 + lVar106);
  lVar11 = *(long *)(_Var10 + 0x38 + lVar106);
  lVar12 = *(long *)(_Var10 + 0x48 + lVar106);
  pfVar1 = (float *)(lVar11 + uVar102 * lVar12);
  auVar113._0_4_ = fVar109 * *pfVar1;
  auVar113._4_4_ = fVar109 * pfVar1[1];
  auVar113._8_4_ = fVar109 * pfVar1[2];
  auVar113._12_4_ = fVar109 * pfVar1[3];
  pfVar1 = (float *)(lVar11 + (uVar102 + 1) * lVar12);
  auVar152._0_4_ = fVar109 * *pfVar1;
  auVar152._4_4_ = fVar109 * pfVar1[1];
  auVar152._8_4_ = fVar109 * pfVar1[2];
  auVar152._12_4_ = fVar109 * pfVar1[3];
  pfVar1 = (float *)(lVar11 + (uVar102 + 2) * lVar12);
  auVar192._0_4_ = fVar109 * *pfVar1;
  auVar192._4_4_ = fVar109 * pfVar1[1];
  auVar192._8_4_ = fVar109 * pfVar1[2];
  auVar192._12_4_ = fVar109 * pfVar1[3];
  pfVar1 = (float *)(lVar11 + lVar12 * (uVar102 + 3));
  auVar212._0_4_ = fVar109 * *pfVar1;
  auVar212._4_4_ = fVar109 * pfVar1[1];
  auVar212._8_4_ = fVar109 * pfVar1[2];
  auVar212._12_4_ = fVar109 * pfVar1[3];
  lVar11 = *(long *)(_Var10 + lVar106);
  fVar109 = 1.0 - fVar109;
  auVar170._4_4_ = fVar109;
  auVar170._0_4_ = fVar109;
  auVar170._8_4_ = fVar109;
  auVar170._12_4_ = fVar109;
  auVar271 = vfmadd231ps_fma(auVar113,auVar170,*(undefined1 (*) [16])(lVar11 + lVar105 * uVar102));
  auVar5 = vfmadd231ps_fma(auVar152,auVar170,
                           *(undefined1 (*) [16])(lVar11 + lVar105 * (uVar102 + 1)));
  auVar6 = vfmadd231ps_fma(auVar192,auVar170,
                           *(undefined1 (*) [16])(lVar11 + lVar105 * (uVar102 + 2)));
  auVar7 = vfmadd231ps_fma(auVar212,auVar170,
                           *(undefined1 (*) [16])(lVar11 + lVar105 * (uVar102 + 3)));
  auVar2 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar3 = vinsertps_avx(auVar2,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar296._4_4_ = uVar110;
  auVar296._0_4_ = uVar110;
  auVar296._8_4_ = uVar110;
  auVar296._12_4_ = uVar110;
  fStack_970 = (float)uVar110;
  _local_980 = auVar296;
  fStack_96c = (float)uVar110;
  fStack_968 = (float)uVar110;
  uStack_964 = uVar110;
  auVar302 = ZEXT3264(_local_980);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar303._4_4_ = uVar110;
  auVar303._0_4_ = uVar110;
  auVar303._8_4_ = uVar110;
  auVar303._12_4_ = uVar110;
  fStack_870 = (float)uVar110;
  _local_880 = auVar303;
  fStack_86c = (float)uVar110;
  fStack_868 = (float)uVar110;
  register0x0000151c = uVar110;
  auVar306 = ZEXT3264(_local_880);
  auVar2 = vunpcklps_avx(auVar296,auVar303);
  fVar109 = *(float *)(ray + k * 4 + 0xc0);
  auVar307._4_4_ = fVar109;
  auVar307._0_4_ = fVar109;
  auVar307._8_4_ = fVar109;
  auVar307._12_4_ = fVar109;
  fStack_890 = fVar109;
  _local_8a0 = auVar307;
  fStack_88c = fVar109;
  fStack_888 = fVar109;
  register0x0000155c = fVar109;
  local_ad0 = vinsertps_avx(auVar2,auVar307,0x28);
  auVar235._0_4_ = (auVar271._0_4_ + auVar5._0_4_ + auVar6._0_4_ + auVar7._0_4_) * 0.25;
  auVar235._4_4_ = (auVar271._4_4_ + auVar5._4_4_ + auVar6._4_4_ + auVar7._4_4_) * 0.25;
  auVar235._8_4_ = (auVar271._8_4_ + auVar5._8_4_ + auVar6._8_4_ + auVar7._8_4_) * 0.25;
  auVar235._12_4_ = (auVar271._12_4_ + auVar5._12_4_ + auVar6._12_4_ + auVar7._12_4_) * 0.25;
  auVar2 = vsubps_avx(auVar235,auVar3);
  auVar2 = vdpps_avx(auVar2,local_ad0,0x7f);
  local_ae0 = vdpps_avx(local_ad0,local_ad0,0x7f);
  auVar292 = ZEXT1664(local_ae0);
  auVar4 = vrcpss_avx(local_ae0,local_ae0);
  auVar116 = vfnmadd213ss_fma(auVar4,local_ae0,ZEXT416(0x40000000));
  local_340 = auVar2._0_4_ * auVar4._0_4_ * auVar116._0_4_;
  auVar243 = ZEXT464((uint)local_340);
  auVar244._4_4_ = local_340;
  auVar244._0_4_ = local_340;
  auVar244._8_4_ = local_340;
  auVar244._12_4_ = local_340;
  fStack_9f0 = local_340;
  _local_a00 = auVar244;
  fStack_9ec = local_340;
  fStack_9e8 = local_340;
  fStack_9e4 = local_340;
  auVar2 = vfmadd231ps_fma(auVar3,local_ad0,auVar244);
  auVar2 = vblendps_avx(auVar2,_DAT_01f45a50,8);
  auVar3 = vsubps_avx(auVar271,auVar2);
  auVar4 = vsubps_avx(auVar6,auVar2);
  auVar271 = vsubps_avx(auVar5,auVar2);
  auVar5 = vsubps_avx(auVar7,auVar2);
  auVar231 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 0x3f8000003f800000)
                                                                       ))))));
  auVar2 = vmovshdup_avx(auVar3);
  local_1e0 = auVar2._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar2 = vshufps_avx(auVar3,auVar3,0xaa);
  local_5e0 = auVar2._0_8_;
  auVar2 = vshufps_avx(auVar3,auVar3,0xff);
  local_600 = auVar2._0_8_;
  auVar2 = vmovshdup_avx(auVar271);
  local_200 = auVar2._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar2 = vshufps_avx(auVar271,auVar271,0xaa);
  local_620 = auVar2._0_8_;
  auVar2 = vshufps_avx(auVar271,auVar271,0xff);
  local_640 = auVar2._0_8_;
  auVar2 = vmovshdup_avx(auVar4);
  local_220 = auVar2._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar2 = vshufps_avx(auVar4,auVar4,0xaa);
  local_660 = auVar2._0_8_;
  auVar2 = vshufps_avx(auVar4,auVar4,0xff);
  local_680 = auVar2._0_8_;
  auVar2 = vmovshdup_avx(auVar5);
  local_240 = auVar2._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar2 = vshufps_avx(auVar5,auVar5,0xaa);
  uVar112 = auVar2._0_8_;
  local_720._8_8_ = uVar112;
  local_720._0_8_ = uVar112;
  local_720._16_8_ = uVar112;
  local_720._24_8_ = uVar112;
  auVar2 = vshufps_avx(auVar5,auVar5,0xff);
  local_6a0 = auVar2._0_8_;
  auVar2 = vfmadd231ps_fma(ZEXT432((uint)(fVar109 * fVar109)),_local_880,_local_880);
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar2),_local_980,_local_980);
  uVar110 = auVar2._0_4_;
  local_260._4_4_ = uVar110;
  local_260._0_4_ = uVar110;
  local_260._8_4_ = uVar110;
  local_260._12_4_ = uVar110;
  local_260._16_4_ = uVar110;
  local_260._20_4_ = uVar110;
  local_260._24_4_ = uVar110;
  local_260._28_4_ = uVar110;
  auVar261 = ZEXT3264(local_260);
  fVar109 = *(float *)(ray + k * 4 + 0x60);
  local_a40 = ZEXT416((uint)local_340);
  local_340 = fVar109 - local_340;
  fStack_33c = local_340;
  fStack_338 = local_340;
  fStack_334 = local_340;
  fStack_330 = local_340;
  fStack_32c = local_340;
  fStack_328 = local_340;
  fStack_324 = local_340;
  uVar107 = 0;
  iVar99 = 1;
  local_b40._0_16_ = auVar3;
  local_6c0 = auVar3._0_4_;
  local_aa0._0_16_ = auVar271;
  local_6e0 = auVar271._0_4_;
  local_700 = auVar4._0_4_;
  fVar168 = auVar5._0_4_;
  local_280 = fVar168;
  fStack_27c = fVar168;
  fStack_278 = fVar168;
  fStack_274 = fVar168;
  fStack_270 = fVar168;
  fStack_26c = fVar168;
  fStack_268 = fVar168;
  fStack_264 = fVar168;
  local_740 = vandps_avx(local_260,local_8c0);
  auVar2 = vsqrtss_avx(local_ae0,local_ae0);
  auVar3 = vsqrtss_avx(local_ae0,local_ae0);
  auVar167 = ZEXT1664(ZEXT816(0x3f80000000000000));
  uStack_77c = local_780;
  uStack_778 = local_780;
  uStack_774 = local_780;
  uStack_770 = local_780;
  uStack_76c = local_780;
  uStack_768 = local_780;
  uStack_764 = local_780;
  local_760 = uVar104;
  uStack_75c = uVar104;
  uStack_758 = uVar104;
  uStack_754 = uVar104;
  uStack_750 = uVar104;
  uStack_74c = uVar104;
  uStack_748 = uVar104;
  uStack_744 = uVar104;
  uStack_6fc = local_700;
  uStack_6f8 = local_700;
  uStack_6f4 = local_700;
  uStack_6f0 = local_700;
  uStack_6ec = local_700;
  uStack_6e8 = local_700;
  uStack_6e4 = local_700;
  uStack_6dc = local_6e0;
  uStack_6d8 = local_6e0;
  uStack_6d4 = local_6e0;
  uStack_6d0 = local_6e0;
  uStack_6cc = local_6e0;
  uStack_6c8 = local_6e0;
  uStack_6c4 = local_6e0;
  uStack_6bc = local_6c0;
  uStack_6b8 = local_6c0;
  uStack_6b4 = local_6c0;
  uStack_6b0 = local_6c0;
  uStack_6ac = local_6c0;
  uStack_6a8 = local_6c0;
  uStack_6a4 = local_6c0;
  uStack_698 = local_6a0;
  uStack_690 = local_6a0;
  uStack_688 = local_6a0;
  uStack_678 = local_680;
  uStack_670 = local_680;
  uStack_668 = local_680;
  uStack_658 = local_660;
  uStack_650 = local_660;
  uStack_648 = local_660;
  uStack_638 = local_640;
  uStack_630 = local_640;
  uStack_628 = local_640;
  uStack_618 = local_620;
  uStack_610 = local_620;
  uStack_608 = local_620;
  uStack_5f8 = local_600;
  uStack_5f0 = local_600;
  uStack_5e8 = local_600;
  uStack_5d8 = local_5e0;
  uStack_5d0 = local_5e0;
  uStack_5c8 = local_5e0;
  do {
    local_7b0 = auVar167._0_16_;
    auVar271 = vmovshdup_avx(local_7b0);
    auVar271 = vsubps_avx(auVar271,local_7b0);
    local_940._0_4_ = auVar271._0_4_;
    fVar262 = local_940._0_4_ * 0.04761905;
    uVar151 = auVar167._0_4_;
    local_920._4_4_ = uVar151;
    local_920._0_4_ = uVar151;
    local_920._8_4_ = uVar151;
    local_920._12_4_ = uVar151;
    local_920._16_4_ = uVar151;
    local_920._20_4_ = uVar151;
    local_920._24_4_ = uVar151;
    local_920._28_4_ = uVar151;
    local_940._4_4_ = local_940._0_4_;
    local_940._8_4_ = local_940._0_4_;
    local_940._12_4_ = local_940._0_4_;
    local_940._16_4_ = local_940._0_4_;
    local_940._20_4_ = local_940._0_4_;
    local_940._24_4_ = local_940._0_4_;
    local_940._28_4_ = local_940._0_4_;
    auVar271 = vfmadd231ps_fma(local_920,local_940,auVar281._0_32_);
    auVar125 = vsubps_avx(auVar231._0_32_,ZEXT1632(auVar271));
    fVar211 = auVar125._0_4_;
    fVar233 = auVar125._4_4_;
    fVar191 = auVar125._8_4_;
    fVar264 = auVar125._12_4_;
    fVar253 = auVar125._16_4_;
    fVar254 = auVar125._20_4_;
    fVar255 = auVar125._24_4_;
    fVar111 = fVar211 * fVar211 * fVar211;
    fVar145 = fVar233 * fVar233 * fVar233;
    fVar146 = fVar191 * fVar191 * fVar191;
    fVar147 = fVar264 * fVar264 * fVar264;
    fVar148 = fVar253 * fVar253 * fVar253;
    fVar149 = fVar254 * fVar254 * fVar254;
    fVar150 = fVar255 * fVar255 * fVar255;
    fVar232 = auVar271._0_4_;
    fVar234 = auVar271._4_4_;
    fVar251 = auVar271._8_4_;
    fVar252 = auVar271._12_4_;
    fVar169 = fVar232 * fVar232 * fVar232;
    fVar188 = fVar234 * fVar234 * fVar234;
    fVar189 = fVar251 * fVar251 * fVar251;
    fVar190 = fVar252 * fVar252 * fVar252;
    fVar270 = fVar211 * fVar232;
    fVar282 = fVar233 * fVar234;
    fVar283 = fVar191 * fVar251;
    fVar284 = fVar264 * fVar252;
    fVar285 = fVar253 * 0.0;
    fVar286 = fVar254 * 0.0;
    fVar287 = fVar255 * 0.0;
    fVar293 = auVar292._28_4_ + auVar306._28_4_;
    fVar294 = fVar293 + local_940._0_4_;
    fVar263 = auVar302._28_4_;
    auVar21._4_4_ = fVar145 * 0.16666667;
    auVar21._0_4_ = fVar111 * 0.16666667;
    auVar21._8_4_ = fVar146 * 0.16666667;
    auVar21._12_4_ = fVar147 * 0.16666667;
    auVar21._16_4_ = fVar148 * 0.16666667;
    auVar21._20_4_ = fVar149 * 0.16666667;
    auVar21._24_4_ = fVar150 * 0.16666667;
    auVar21._28_4_ = fVar294;
    auVar22._4_4_ =
         (fVar233 * fVar282 * 12.0 + fVar282 * fVar234 * 6.0 + fVar188 + fVar145 * 4.0) * 0.16666667
    ;
    auVar22._0_4_ =
         (fVar211 * fVar270 * 12.0 + fVar270 * fVar232 * 6.0 + fVar169 + fVar111 * 4.0) * 0.16666667
    ;
    auVar22._8_4_ =
         (fVar191 * fVar283 * 12.0 + fVar283 * fVar251 * 6.0 + fVar189 + fVar146 * 4.0) * 0.16666667
    ;
    auVar22._12_4_ =
         (fVar264 * fVar284 * 12.0 + fVar284 * fVar252 * 6.0 + fVar190 + fVar147 * 4.0) * 0.16666667
    ;
    auVar22._16_4_ =
         (fVar253 * fVar285 * 12.0 + fVar285 * 0.0 * 6.0 + fVar148 * 4.0 + 0.0) * 0.16666667;
    auVar22._20_4_ =
         (fVar254 * fVar286 * 12.0 + fVar286 * 0.0 * 6.0 + fVar149 * 4.0 + 0.0) * 0.16666667;
    auVar22._24_4_ =
         (fVar255 * fVar287 * 12.0 + fVar287 * 0.0 * 6.0 + fVar150 * 4.0 + 0.0) * 0.16666667;
    auVar22._28_4_ = fVar263;
    auVar23._4_4_ =
         (fVar188 * 4.0 + fVar145 + fVar282 * fVar234 * 12.0 + fVar233 * fVar282 * 6.0) * 0.16666667
    ;
    auVar23._0_4_ =
         (fVar169 * 4.0 + fVar111 + fVar270 * fVar232 * 12.0 + fVar211 * fVar270 * 6.0) * 0.16666667
    ;
    auVar23._8_4_ =
         (fVar189 * 4.0 + fVar146 + fVar283 * fVar251 * 12.0 + fVar191 * fVar283 * 6.0) * 0.16666667
    ;
    auVar23._12_4_ =
         (fVar190 * 4.0 + fVar147 + fVar284 * fVar252 * 12.0 + fVar264 * fVar284 * 6.0) * 0.16666667
    ;
    auVar23._16_4_ = (fVar148 + 0.0 + fVar285 * 0.0 * 12.0 + fVar253 * fVar285 * 6.0) * 0.16666667;
    auVar23._20_4_ = (fVar149 + 0.0 + fVar286 * 0.0 * 12.0 + fVar254 * fVar286 * 6.0) * 0.16666667;
    auVar23._24_4_ = (fVar150 + 0.0 + fVar287 * 0.0 * 12.0 + fVar255 * fVar287 * 6.0) * 0.16666667;
    auVar23._28_4_ = auVar306._28_4_;
    fVar169 = fVar169 * 0.16666667;
    fVar188 = fVar188 * 0.16666667;
    fVar189 = fVar189 * 0.16666667;
    fVar190 = fVar190 * 0.16666667;
    auVar24._4_4_ = fStack_27c * fVar188;
    auVar24._0_4_ = local_280 * fVar169;
    auVar24._8_4_ = fStack_278 * fVar189;
    auVar24._12_4_ = fStack_274 * fVar190;
    auVar24._16_4_ = fStack_270 * 0.0;
    auVar24._20_4_ = fStack_26c * 0.0;
    auVar24._24_4_ = fStack_268 * 0.0;
    auVar24._28_4_ = local_940._0_4_;
    auVar25._4_4_ = local_240._4_4_ * fVar188;
    auVar25._0_4_ = (float)local_240 * fVar169;
    auVar25._8_4_ = (float)uStack_238 * fVar189;
    auVar25._12_4_ = uStack_238._4_4_ * fVar190;
    auVar25._16_4_ = (float)uStack_230 * 0.0;
    auVar25._20_4_ = uStack_230._4_4_ * 0.0;
    auVar25._24_4_ = (float)uStack_228 * 0.0;
    auVar25._28_4_ = 0x3e2aaaab;
    auVar26._4_4_ = local_720._4_4_ * fVar188;
    auVar26._0_4_ = local_720._0_4_ * fVar169;
    auVar26._8_4_ = local_720._8_4_ * fVar189;
    auVar26._12_4_ = local_720._12_4_ * fVar190;
    auVar26._16_4_ = local_720._16_4_ * 0.0;
    auVar26._20_4_ = local_720._20_4_ * 0.0;
    auVar26._24_4_ = local_720._24_4_ * 0.0;
    auVar26._28_4_ = fVar293 + auVar167._28_4_ + 0.0;
    auVar27._4_4_ = fVar188 * local_6a0._4_4_;
    auVar27._0_4_ = fVar169 * (float)local_6a0;
    auVar27._8_4_ = fVar189 * (float)uStack_698;
    auVar27._12_4_ = fVar190 * uStack_698._4_4_;
    auVar27._16_4_ = (float)uStack_690 * 0.0;
    auVar27._20_4_ = uStack_690._4_4_ * 0.0;
    auVar27._24_4_ = (float)uStack_688 * 0.0;
    auVar27._28_4_ = fVar294 + fVar263 + auVar243._28_4_;
    auVar75._4_4_ = uStack_6fc;
    auVar75._0_4_ = local_700;
    auVar75._8_4_ = uStack_6f8;
    auVar75._12_4_ = uStack_6f4;
    auVar75._16_4_ = uStack_6f0;
    auVar75._20_4_ = uStack_6ec;
    auVar75._24_4_ = uStack_6e8;
    auVar75._28_4_ = uStack_6e4;
    auVar271 = vfmadd231ps_fma(auVar24,auVar23,auVar75);
    auVar96._8_8_ = uStack_218;
    auVar96._0_8_ = local_220;
    auVar96._16_8_ = uStack_210;
    auVar96._24_8_ = uStack_208;
    auVar6 = vfmadd231ps_fma(auVar25,auVar23,auVar96);
    auVar83._8_8_ = uStack_658;
    auVar83._0_8_ = local_660;
    auVar83._16_8_ = uStack_650;
    auVar83._24_8_ = uStack_648;
    auVar7 = vfmadd231ps_fma(auVar26,auVar23,auVar83);
    auVar81._8_8_ = uStack_678;
    auVar81._0_8_ = local_680;
    auVar81._16_8_ = uStack_670;
    auVar81._24_8_ = uStack_668;
    auVar116 = vfmadd231ps_fma(auVar27,auVar23,auVar81);
    auVar77._4_4_ = uStack_6dc;
    auVar77._0_4_ = local_6e0;
    auVar77._8_4_ = uStack_6d8;
    auVar77._12_4_ = uStack_6d4;
    auVar77._16_4_ = uStack_6d0;
    auVar77._20_4_ = uStack_6cc;
    auVar77._24_4_ = uStack_6c8;
    auVar77._28_4_ = uStack_6c4;
    auVar271 = vfmadd231ps_fma(ZEXT1632(auVar271),auVar22,auVar77);
    auVar97._8_8_ = uStack_1f8;
    auVar97._0_8_ = local_200;
    auVar97._16_8_ = uStack_1f0;
    auVar97._24_8_ = uStack_1e8;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar22,auVar97);
    auVar87._8_8_ = uStack_618;
    auVar87._0_8_ = local_620;
    auVar87._16_8_ = uStack_610;
    auVar87._24_8_ = uStack_608;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar22,auVar87);
    auVar85._8_8_ = uStack_638;
    auVar85._0_8_ = local_640;
    auVar85._16_8_ = uStack_630;
    auVar85._24_8_ = uStack_628;
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar22,auVar85);
    auVar79._4_4_ = uStack_6bc;
    auVar79._0_4_ = local_6c0;
    auVar79._8_4_ = uStack_6b8;
    auVar79._12_4_ = uStack_6b4;
    auVar79._16_4_ = uStack_6b0;
    auVar79._20_4_ = uStack_6ac;
    auVar79._24_4_ = uStack_6a8;
    auVar79._28_4_ = uStack_6a4;
    auVar271 = vfmadd231ps_fma(ZEXT1632(auVar271),auVar21,auVar79);
    auVar127 = ZEXT1632(auVar271);
    auVar98._8_8_ = uStack_1d8;
    auVar98._0_8_ = local_1e0;
    auVar98._16_8_ = uStack_1d0;
    auVar98._24_8_ = uStack_1c8;
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar21,auVar98);
    auVar91._8_8_ = uStack_5d8;
    auVar91._0_8_ = local_5e0;
    auVar91._16_8_ = uStack_5d0;
    auVar91._24_8_ = uStack_5c8;
    auVar271 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar21,auVar91);
    auVar89._8_8_ = uStack_5f8;
    auVar89._0_8_ = local_600;
    auVar89._16_8_ = uStack_5f0;
    auVar89._24_8_ = uStack_5e8;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar21,auVar89);
    auVar246._0_4_ = -fVar232 * fVar232;
    auVar246._4_4_ = -fVar234 * fVar234;
    auVar246._8_4_ = -fVar251 * fVar251;
    auVar246._12_4_ = -fVar252 * fVar252;
    auVar246._16_4_ = 0x80000000;
    auVar246._20_4_ = 0x80000000;
    auVar246._24_4_ = 0x80000000;
    auVar246._28_4_ = 0;
    auVar28._4_4_ = fVar282 * 4.0;
    auVar28._0_4_ = fVar270 * 4.0;
    auVar28._8_4_ = fVar283 * 4.0;
    auVar28._12_4_ = fVar284 * 4.0;
    auVar28._16_4_ = fVar285 * 4.0;
    auVar28._20_4_ = fVar286 * 4.0;
    fVar111 = auVar281._28_4_;
    auVar28._24_4_ = fVar287 * 4.0;
    auVar28._28_4_ = fVar111;
    auVar187 = vsubps_avx(auVar246,auVar28);
    fVar145 = fVar111 + auVar261._28_4_;
    auVar29._4_4_ = fVar233 * -fVar233 * 0.5;
    auVar29._0_4_ = fVar211 * -fVar211 * 0.5;
    auVar29._8_4_ = fVar191 * -fVar191 * 0.5;
    auVar29._12_4_ = fVar264 * -fVar264 * 0.5;
    auVar29._16_4_ = fVar253 * -fVar253 * 0.5;
    auVar29._20_4_ = fVar254 * -fVar254 * 0.5;
    auVar29._24_4_ = fVar255 * -fVar255 * 0.5;
    auVar29._28_4_ = auVar125._28_4_;
    auVar30._4_4_ = auVar187._4_4_ * 0.5;
    auVar30._0_4_ = auVar187._0_4_ * 0.5;
    auVar30._8_4_ = auVar187._8_4_ * 0.5;
    auVar30._12_4_ = auVar187._12_4_ * 0.5;
    auVar30._16_4_ = auVar187._16_4_ * 0.5;
    auVar30._20_4_ = auVar187._20_4_ * 0.5;
    auVar30._24_4_ = auVar187._24_4_ * 0.5;
    auVar30._28_4_ = auVar187._28_4_;
    auVar31._4_4_ = (fVar282 * 4.0 + fVar233 * fVar233) * 0.5;
    auVar31._0_4_ = (fVar270 * 4.0 + fVar211 * fVar211) * 0.5;
    auVar31._8_4_ = (fVar283 * 4.0 + fVar191 * fVar191) * 0.5;
    auVar31._12_4_ = (fVar284 * 4.0 + fVar264 * fVar264) * 0.5;
    auVar31._16_4_ = (fVar285 * 4.0 + fVar253 * fVar253) * 0.5;
    auVar31._20_4_ = (fVar286 * 4.0 + fVar254 * fVar254) * 0.5;
    auVar31._24_4_ = (fVar287 * 4.0 + fVar255 * fVar255) * 0.5;
    auVar31._28_4_ = fVar145;
    fVar211 = fVar232 * fVar232 * 0.5;
    fVar232 = fVar234 * fVar234 * 0.5;
    fVar233 = fVar251 * fVar251 * 0.5;
    fVar234 = fVar252 * fVar252 * 0.5;
    auVar32._4_4_ = fStack_27c * fVar232;
    auVar32._0_4_ = local_280 * fVar211;
    auVar32._8_4_ = fStack_278 * fVar233;
    auVar32._12_4_ = fStack_274 * fVar234;
    auVar32._16_4_ = fStack_270 * 0.0;
    auVar32._20_4_ = fStack_26c * 0.0;
    auVar32._24_4_ = fStack_268 * 0.0;
    auVar32._28_4_ = fVar111;
    auVar33._4_4_ = local_240._4_4_ * fVar232;
    auVar33._0_4_ = (float)local_240 * fVar211;
    auVar33._8_4_ = (float)uStack_238 * fVar233;
    auVar33._12_4_ = uStack_238._4_4_ * fVar234;
    auVar33._16_4_ = (float)uStack_230 * 0.0;
    auVar33._20_4_ = uStack_230._4_4_ * 0.0;
    auVar33._24_4_ = (float)uStack_228 * 0.0;
    auVar33._28_4_ = 0x80000000;
    auVar34._4_4_ = fVar232 * local_720._4_4_;
    auVar34._0_4_ = fVar211 * local_720._0_4_;
    auVar34._8_4_ = fVar233 * local_720._8_4_;
    auVar34._12_4_ = fVar234 * local_720._12_4_;
    auVar34._16_4_ = local_720._16_4_ * 0.0;
    auVar34._20_4_ = local_720._20_4_ * 0.0;
    auVar34._24_4_ = local_720._24_4_ * 0.0;
    auVar34._28_4_ = fVar263;
    auVar35._4_4_ = fVar232 * local_6a0._4_4_;
    auVar35._0_4_ = fVar211 * (float)local_6a0;
    auVar35._8_4_ = fVar233 * (float)uStack_698;
    auVar35._12_4_ = fVar234 * uStack_698._4_4_;
    auVar35._16_4_ = (float)uStack_690 * 0.0;
    auVar35._20_4_ = uStack_690._4_4_ * 0.0;
    auVar35._24_4_ = (float)uStack_688 * 0.0;
    auVar35._28_4_ = auVar231._28_4_;
    auVar76._4_4_ = uStack_6fc;
    auVar76._0_4_ = local_700;
    auVar76._8_4_ = uStack_6f8;
    auVar76._12_4_ = uStack_6f4;
    auVar76._16_4_ = uStack_6f0;
    auVar76._20_4_ = uStack_6ec;
    auVar76._24_4_ = uStack_6e8;
    auVar76._28_4_ = uStack_6e4;
    auVar116 = vfmadd231ps_fma(auVar32,auVar31,auVar76);
    auVar308 = vfmadd231ps_fma(auVar33,auVar31,auVar96);
    auVar84._8_8_ = uStack_658;
    auVar84._0_8_ = local_660;
    auVar84._16_8_ = uStack_650;
    auVar84._24_8_ = uStack_648;
    auVar295 = vfmadd231ps_fma(auVar34,auVar31,auVar84);
    auVar82._8_8_ = uStack_678;
    auVar82._0_8_ = local_680;
    auVar82._16_8_ = uStack_670;
    auVar82._24_8_ = uStack_668;
    auVar265 = vfmadd231ps_fma(auVar35,auVar31,auVar82);
    auVar78._4_4_ = uStack_6dc;
    auVar78._0_4_ = local_6e0;
    auVar78._8_4_ = uStack_6d8;
    auVar78._12_4_ = uStack_6d4;
    auVar78._16_4_ = uStack_6d0;
    auVar78._20_4_ = uStack_6cc;
    auVar78._24_4_ = uStack_6c8;
    auVar78._28_4_ = uStack_6c4;
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar30,auVar78);
    auVar308 = vfmadd231ps_fma(ZEXT1632(auVar308),auVar30,auVar97);
    auVar88._8_8_ = uStack_618;
    auVar88._0_8_ = local_620;
    auVar88._16_8_ = uStack_610;
    auVar88._24_8_ = uStack_608;
    auVar295 = vfmadd231ps_fma(ZEXT1632(auVar295),auVar30,auVar88);
    auVar86._8_8_ = uStack_638;
    auVar86._0_8_ = local_640;
    auVar86._16_8_ = uStack_630;
    auVar86._24_8_ = uStack_628;
    auVar265 = vfmadd231ps_fma(ZEXT1632(auVar265),auVar30,auVar86);
    auVar80._4_4_ = uStack_6bc;
    auVar80._0_4_ = local_6c0;
    auVar80._8_4_ = uStack_6b8;
    auVar80._12_4_ = uStack_6b4;
    auVar80._16_4_ = uStack_6b0;
    auVar80._20_4_ = uStack_6ac;
    auVar80._24_4_ = uStack_6a8;
    auVar80._28_4_ = uStack_6a4;
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar29,auVar80);
    auVar308 = vfmadd231ps_fma(ZEXT1632(auVar308),auVar29,auVar98);
    auVar92._8_8_ = uStack_5d8;
    auVar92._0_8_ = local_5e0;
    auVar92._16_8_ = uStack_5d0;
    auVar92._24_8_ = uStack_5c8;
    auVar295 = vfmadd231ps_fma(ZEXT1632(auVar295),auVar29,auVar92);
    auVar90._8_8_ = uStack_5f8;
    auVar90._0_8_ = local_600;
    auVar90._16_8_ = uStack_5f0;
    auVar90._24_8_ = uStack_5e8;
    auVar265 = vfmadd231ps_fma(ZEXT1632(auVar265),auVar29,auVar90);
    local_a80._0_4_ = auVar116._0_4_ * fVar262;
    local_a80._4_4_ = auVar116._4_4_ * fVar262;
    local_a80._8_4_ = auVar116._8_4_ * fVar262;
    local_a80._12_4_ = auVar116._12_4_ * fVar262;
    local_a80._16_4_ = fVar262 * 0.0;
    local_a80._20_4_ = fVar262 * 0.0;
    local_a80._24_4_ = fVar262 * 0.0;
    local_a80._28_4_ = 0;
    local_900._0_4_ = auVar308._0_4_ * fVar262;
    local_900._4_4_ = auVar308._4_4_ * fVar262;
    local_900._8_4_ = auVar308._8_4_ * fVar262;
    local_900._12_4_ = auVar308._12_4_ * fVar262;
    local_900._16_4_ = fVar262 * 0.0;
    local_900._20_4_ = fVar262 * 0.0;
    local_900._24_4_ = fVar262 * 0.0;
    local_900._28_4_ = 0;
    auVar298._0_4_ = auVar295._0_4_ * fVar262;
    auVar298._4_4_ = auVar295._4_4_ * fVar262;
    auVar298._8_4_ = auVar295._8_4_ * fVar262;
    auVar298._12_4_ = auVar295._12_4_ * fVar262;
    auVar298._16_4_ = fVar262 * 0.0;
    auVar298._20_4_ = fVar262 * 0.0;
    auVar298._24_4_ = fVar262 * 0.0;
    auVar298._28_4_ = 0;
    fVar211 = fVar262 * auVar265._0_4_;
    fVar232 = fVar262 * auVar265._4_4_;
    auVar36._4_4_ = fVar232;
    auVar36._0_4_ = fVar211;
    fVar233 = fVar262 * auVar265._8_4_;
    auVar36._8_4_ = fVar233;
    fVar234 = fVar262 * auVar265._12_4_;
    auVar36._12_4_ = fVar234;
    auVar36._16_4_ = fVar262 * 0.0;
    auVar36._20_4_ = fVar262 * 0.0;
    auVar36._24_4_ = fVar262 * 0.0;
    auVar36._28_4_ = fVar262;
    auVar124 = vpermps_avx2(_DAT_01fb7720,auVar127);
    auVar126 = ZEXT1632(auVar271);
    local_8e0 = vpermps_avx2(_DAT_01fb7720,auVar126);
    local_2e0 = vsubps_avx(auVar124,auVar127);
    local_2c0 = vsubps_avx(local_8e0,ZEXT1632(auVar271));
    fVar252 = local_2c0._0_4_;
    fVar253 = local_2c0._4_4_;
    auVar37._4_4_ = fVar253 * local_a80._4_4_;
    auVar37._0_4_ = fVar252 * local_a80._0_4_;
    fVar254 = local_2c0._8_4_;
    auVar37._8_4_ = fVar254 * local_a80._8_4_;
    fVar255 = local_2c0._12_4_;
    auVar37._12_4_ = fVar255 * local_a80._12_4_;
    fVar147 = local_2c0._16_4_;
    auVar37._16_4_ = fVar147 * local_a80._16_4_;
    fVar148 = local_2c0._20_4_;
    auVar37._20_4_ = fVar148 * local_a80._20_4_;
    fVar149 = local_2c0._24_4_;
    auVar37._24_4_ = fVar149 * local_a80._24_4_;
    auVar37._28_4_ = local_8e0._28_4_;
    auVar271 = vfmsub231ps_fma(auVar37,auVar298,local_2e0);
    local_ba0 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar6));
    local_300 = vsubps_avx(local_ba0,ZEXT1632(auVar6));
    fVar190 = local_2e0._0_4_;
    fVar270 = local_2e0._4_4_;
    auVar38._4_4_ = fVar270 * local_900._4_4_;
    auVar38._0_4_ = fVar190 * (float)local_900._0_4_;
    fVar282 = local_2e0._8_4_;
    auVar38._8_4_ = fVar282 * local_900._8_4_;
    fVar283 = local_2e0._12_4_;
    auVar38._12_4_ = fVar283 * local_900._12_4_;
    fVar284 = local_2e0._16_4_;
    auVar38._16_4_ = fVar284 * local_900._16_4_;
    fVar285 = local_2e0._20_4_;
    auVar38._20_4_ = fVar285 * local_900._20_4_;
    fVar286 = local_2e0._24_4_;
    auVar38._24_4_ = fVar286 * local_900._24_4_;
    auVar38._28_4_ = 0;
    auVar116 = vfmsub231ps_fma(auVar38,local_a80,local_300);
    auVar271 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar116._12_4_ * auVar116._12_4_,
                                                  CONCAT48(auVar116._8_4_ * auVar116._8_4_,
                                                           CONCAT44(auVar116._4_4_ * auVar116._4_4_,
                                                                    auVar116._0_4_ * auVar116._0_4_)
                                                          ))),ZEXT1632(auVar271),ZEXT1632(auVar271))
    ;
    auVar223._0_4_ = fVar252 * fVar252;
    auVar223._4_4_ = fVar253 * fVar253;
    auVar223._8_4_ = fVar254 * fVar254;
    auVar223._12_4_ = fVar255 * fVar255;
    auVar223._16_4_ = fVar147 * fVar147;
    auVar223._20_4_ = fVar148 * fVar148;
    auVar223._24_4_ = fVar149 * fVar149;
    auVar223._28_4_ = 0;
    auVar116 = vfmadd231ps_fma(auVar223,local_300,local_300);
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),local_2e0,local_2e0);
    fVar263 = local_300._0_4_;
    fVar111 = local_300._4_4_;
    auVar39._4_4_ = fVar111 * auVar298._4_4_;
    auVar39._0_4_ = fVar263 * auVar298._0_4_;
    fVar146 = local_300._8_4_;
    auVar39._8_4_ = fVar146 * auVar298._8_4_;
    fVar150 = local_300._12_4_;
    auVar39._12_4_ = fVar150 * auVar298._12_4_;
    fVar169 = local_300._16_4_;
    auVar39._16_4_ = fVar169 * auVar298._16_4_;
    fVar188 = local_300._20_4_;
    auVar39._20_4_ = fVar188 * auVar298._20_4_;
    fVar189 = local_300._24_4_;
    auVar39._24_4_ = fVar189 * auVar298._24_4_;
    auVar39._28_4_ = fVar145;
    auVar125 = vrcpps_avx(ZEXT1632(auVar116));
    auVar308 = vfmsub231ps_fma(auVar39,local_900,local_2c0);
    auVar308 = vfmadd231ps_fma(ZEXT1632(auVar271),ZEXT1632(auVar308),ZEXT1632(auVar308));
    auVar182._8_4_ = 0x3f800000;
    auVar182._0_8_ = 0x3f8000003f800000;
    auVar182._12_4_ = 0x3f800000;
    auVar182._16_4_ = 0x3f800000;
    auVar182._20_4_ = 0x3f800000;
    auVar182._24_4_ = 0x3f800000;
    auVar182._28_4_ = 0x3f800000;
    auVar271 = vfnmadd213ps_fma(auVar125,ZEXT1632(auVar116),auVar182);
    auVar271 = vfmadd132ps_fma(ZEXT1632(auVar271),auVar125,auVar125);
    auVar259 = vpermps_avx2(_DAT_01fb7720,local_a80);
    local_b00 = vpermps_avx2(_DAT_01fb7720,auVar298);
    auVar40._4_4_ = fVar253 * auVar259._4_4_;
    auVar40._0_4_ = fVar252 * auVar259._0_4_;
    auVar40._8_4_ = fVar254 * auVar259._8_4_;
    auVar40._12_4_ = fVar255 * auVar259._12_4_;
    auVar40._16_4_ = fVar147 * auVar259._16_4_;
    auVar40._20_4_ = fVar148 * auVar259._20_4_;
    auVar40._24_4_ = fVar149 * auVar259._24_4_;
    auVar40._28_4_ = auVar125._28_4_;
    auVar295 = vfmsub231ps_fma(auVar40,local_b00,local_2e0);
    local_b20 = vpermps_avx2(_DAT_01fb7720,local_900);
    auVar41._4_4_ = fVar270 * local_b20._4_4_;
    auVar41._0_4_ = fVar190 * local_b20._0_4_;
    auVar41._8_4_ = fVar282 * local_b20._8_4_;
    auVar41._12_4_ = fVar283 * local_b20._12_4_;
    auVar41._16_4_ = fVar284 * local_b20._16_4_;
    auVar41._20_4_ = fVar285 * local_b20._20_4_;
    auVar41._24_4_ = fVar286 * local_b20._24_4_;
    auVar41._28_4_ = 0;
    auVar265 = vfmsub231ps_fma(auVar41,auVar259,local_300);
    auVar295 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar265._12_4_ * auVar265._12_4_,
                                                  CONCAT48(auVar265._8_4_ * auVar265._8_4_,
                                                           CONCAT44(auVar265._4_4_ * auVar265._4_4_,
                                                                    auVar265._0_4_ * auVar265._0_4_)
                                                          ))),ZEXT1632(auVar295),ZEXT1632(auVar295))
    ;
    auVar267._0_4_ = fVar263 * local_b00._0_4_;
    auVar267._4_4_ = fVar111 * local_b00._4_4_;
    auVar267._8_4_ = fVar146 * local_b00._8_4_;
    auVar267._12_4_ = fVar150 * local_b00._12_4_;
    auVar267._16_4_ = fVar169 * local_b00._16_4_;
    auVar267._20_4_ = fVar188 * local_b00._20_4_;
    auVar267._24_4_ = fVar189 * local_b00._24_4_;
    auVar267._28_4_ = 0;
    auVar265 = vfmsub231ps_fma(auVar267,local_b20,local_2c0);
    auVar295 = vfmadd231ps_fma(ZEXT1632(auVar295),ZEXT1632(auVar265),ZEXT1632(auVar265));
    auVar125 = vmaxps_avx(ZEXT1632(CONCAT412(auVar308._12_4_ * auVar271._12_4_,
                                             CONCAT48(auVar308._8_4_ * auVar271._8_4_,
                                                      CONCAT44(auVar308._4_4_ * auVar271._4_4_,
                                                               auVar308._0_4_ * auVar271._0_4_)))),
                          ZEXT1632(CONCAT412(auVar295._12_4_ * auVar271._12_4_,
                                             CONCAT48(auVar295._8_4_ * auVar271._8_4_,
                                                      CONCAT44(auVar295._4_4_ * auVar271._4_4_,
                                                               auVar295._0_4_ * auVar271._0_4_)))));
    local_960._0_4_ = fVar211 + auVar7._0_4_;
    local_960._4_4_ = fVar232 + auVar7._4_4_;
    local_960._8_4_ = fVar233 + auVar7._8_4_;
    local_960._12_4_ = fVar234 + auVar7._12_4_;
    local_960._16_4_ = fVar262 * 0.0 + 0.0;
    local_960._20_4_ = fVar262 * 0.0 + 0.0;
    local_960._24_4_ = fVar262 * 0.0 + 0.0;
    local_960._28_4_ = fVar262 + 0.0;
    auVar187 = vsubps_avx(ZEXT1632(auVar7),auVar36);
    auVar18 = vpermps_avx2(_DAT_01fb7720,auVar187);
    auVar157 = ZEXT1632(auVar7);
    auVar19 = vpermps_avx2(_DAT_01fb7720,auVar157);
    auVar187 = vmaxps_avx(auVar157,local_960);
    auVar129 = vrsqrtps_avx(ZEXT1632(auVar116));
    auVar17 = vmaxps_avx(auVar18,auVar19);
    auVar17 = vmaxps_avx(auVar187,auVar17);
    fVar211 = auVar129._0_4_;
    fVar232 = auVar129._4_4_;
    fVar233 = auVar129._8_4_;
    fVar234 = auVar129._12_4_;
    fVar191 = auVar129._16_4_;
    fVar251 = auVar129._20_4_;
    fVar264 = auVar129._24_4_;
    auVar240._0_4_ = fVar211 * fVar211 * fVar211 * auVar116._0_4_ * -0.5;
    auVar240._4_4_ = fVar232 * fVar232 * fVar232 * auVar116._4_4_ * -0.5;
    auVar240._8_4_ = fVar233 * fVar233 * fVar233 * auVar116._8_4_ * -0.5;
    auVar240._12_4_ = fVar234 * fVar234 * fVar234 * auVar116._12_4_ * -0.5;
    auVar240._16_4_ = fVar191 * fVar191 * fVar191 * -0.0;
    auVar240._20_4_ = fVar251 * fVar251 * fVar251 * -0.0;
    auVar240._24_4_ = fVar264 * fVar264 * fVar264 * -0.0;
    auVar240._28_4_ = 0;
    auVar128._8_4_ = 0x3fc00000;
    auVar128._0_8_ = 0x3fc000003fc00000;
    auVar128._12_4_ = 0x3fc00000;
    auVar128._16_4_ = 0x3fc00000;
    auVar128._20_4_ = 0x3fc00000;
    auVar128._24_4_ = 0x3fc00000;
    auVar128._28_4_ = 0x3fc00000;
    auVar271 = vfmadd231ps_fma(auVar240,auVar128,auVar129);
    auVar243 = ZEXT1664(auVar271);
    fVar232 = auVar271._0_4_;
    fVar233 = auVar271._4_4_;
    auVar42._4_4_ = fVar111 * fVar233;
    auVar42._0_4_ = fVar263 * fVar232;
    fVar191 = auVar271._8_4_;
    auVar42._8_4_ = fVar146 * fVar191;
    fVar264 = auVar271._12_4_;
    auVar42._12_4_ = fVar150 * fVar264;
    auVar42._16_4_ = fVar169 * 0.0;
    auVar42._20_4_ = fVar188 * 0.0;
    auVar42._24_4_ = fVar189 * 0.0;
    auVar42._28_4_ = auVar187._28_4_;
    auVar43._4_4_ = (float)local_8a0._4_4_ * fVar253 * fVar233;
    auVar43._0_4_ = (float)local_8a0._0_4_ * fVar252 * fVar232;
    auVar43._8_4_ = fStack_898 * fVar254 * fVar191;
    auVar43._12_4_ = fStack_894 * fVar255 * fVar264;
    auVar43._16_4_ = fStack_890 * fVar147 * 0.0;
    auVar43._20_4_ = fStack_88c * fVar148 * 0.0;
    auVar43._24_4_ = fStack_888 * fVar149 * 0.0;
    auVar43._28_4_ = local_2c0._28_4_;
    auVar7 = vfmadd231ps_fma(auVar43,auVar42,_local_880);
    auVar129 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar187 = vsubps_avx(auVar129,auVar126);
    fVar262 = auVar187._0_4_;
    fVar263 = auVar187._4_4_;
    auVar44._4_4_ = fVar263 * fVar253 * fVar233;
    auVar44._0_4_ = fVar262 * fVar252 * fVar232;
    fVar111 = auVar187._8_4_;
    auVar44._8_4_ = fVar111 * fVar254 * fVar191;
    fVar145 = auVar187._12_4_;
    auVar44._12_4_ = fVar145 * fVar255 * fVar264;
    fVar146 = auVar187._16_4_;
    auVar44._16_4_ = fVar146 * fVar147 * 0.0;
    fVar147 = auVar187._20_4_;
    auVar44._20_4_ = fVar147 * fVar148 * 0.0;
    fVar148 = auVar187._24_4_;
    auVar44._24_4_ = fVar148 * fVar149 * 0.0;
    auVar44._28_4_ = local_300._28_4_;
    local_2a0 = ZEXT1632(auVar6);
    auVar129 = vsubps_avx(auVar129,local_2a0);
    auVar261 = ZEXT3264(auVar129);
    auVar6 = vfmadd231ps_fma(auVar44,auVar129,auVar42);
    auVar45._4_4_ = fVar270 * fVar233;
    auVar45._0_4_ = fVar190 * fVar232;
    auVar45._8_4_ = fVar282 * fVar191;
    auVar45._12_4_ = fVar283 * fVar264;
    auVar45._16_4_ = fVar284 * 0.0;
    auVar45._20_4_ = fVar285 * 0.0;
    auVar45._24_4_ = fVar286 * 0.0;
    auVar45._28_4_ = 0;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar45,_local_980);
    auVar306 = ZEXT1664(auVar7);
    auVar130 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar15 = vsubps_avx(auVar130,auVar127);
    auVar6 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar15,auVar45);
    auVar46._4_4_ = fVar263 * (float)local_8a0._4_4_;
    auVar46._0_4_ = fVar262 * (float)local_8a0._0_4_;
    auVar46._8_4_ = fVar111 * fStack_898;
    auVar46._12_4_ = fVar145 * fStack_894;
    auVar46._16_4_ = fVar146 * fStack_890;
    auVar46._20_4_ = fVar147 * fStack_88c;
    auVar46._24_4_ = fVar148 * fStack_888;
    auVar46._28_4_ = 0;
    auVar116 = vfmadd231ps_fma(auVar46,_local_880,auVar129);
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),_local_980,auVar15);
    fVar211 = auVar6._0_4_;
    fVar149 = auVar7._0_4_;
    fVar234 = auVar6._4_4_;
    fVar150 = auVar7._4_4_;
    fVar251 = auVar6._8_4_;
    fVar169 = auVar7._8_4_;
    fVar252 = auVar6._12_4_;
    fVar188 = auVar7._12_4_;
    uVar110 = local_880._28_4_;
    auVar47._28_4_ = uVar110;
    auVar47._0_28_ =
         ZEXT1628(CONCAT412(fVar188 * fVar252,
                            CONCAT48(fVar169 * fVar251,CONCAT44(fVar150 * fVar234,fVar149 * fVar211)
                                    )));
    auVar134 = vsubps_avx(ZEXT1632(auVar116),auVar47);
    auVar48._4_4_ = fVar263 * fVar263;
    auVar48._0_4_ = fVar262 * fVar262;
    auVar48._8_4_ = fVar111 * fVar111;
    auVar48._12_4_ = fVar145 * fVar145;
    auVar48._16_4_ = fVar146 * fVar146;
    auVar48._20_4_ = fVar147 * fVar147;
    auVar48._24_4_ = fVar148 * fVar148;
    auVar48._28_4_ = uVar110;
    auVar116 = vfmadd231ps_fma(auVar48,auVar129,auVar129);
    auVar116 = vfmadd231ps_fma(ZEXT1632(auVar116),auVar15,auVar15);
    auVar159 = vsubps_avx(ZEXT1632(auVar116),
                          ZEXT1632(CONCAT412(fVar252 * fVar252,
                                             CONCAT48(fVar251 * fVar251,
                                                      CONCAT44(fVar234 * fVar234,fVar211 * fVar211))
                                            )));
    auVar187 = vsqrtps_avx(auVar125);
    fVar211 = (auVar17._0_4_ + auVar187._0_4_) * 1.0000002;
    fVar234 = (auVar17._4_4_ + auVar187._4_4_) * 1.0000002;
    fVar251 = (auVar17._8_4_ + auVar187._8_4_) * 1.0000002;
    fVar252 = (auVar17._12_4_ + auVar187._12_4_) * 1.0000002;
    fVar253 = (auVar17._16_4_ + auVar187._16_4_) * 1.0000002;
    fVar254 = (auVar17._20_4_ + auVar187._20_4_) * 1.0000002;
    fVar255 = (auVar17._24_4_ + auVar187._24_4_) * 1.0000002;
    auVar49._4_4_ = fVar234 * fVar234;
    auVar49._0_4_ = fVar211 * fVar211;
    auVar49._8_4_ = fVar251 * fVar251;
    auVar49._12_4_ = fVar252 * fVar252;
    auVar49._16_4_ = fVar253 * fVar253;
    auVar49._20_4_ = fVar254 * fVar254;
    auVar49._24_4_ = fVar255 * fVar255;
    auVar49._28_4_ = auVar17._28_4_ + auVar187._28_4_;
    local_320._0_4_ = auVar134._0_4_ + auVar134._0_4_;
    local_320._4_4_ = auVar134._4_4_ + auVar134._4_4_;
    local_320._8_4_ = auVar134._8_4_ + auVar134._8_4_;
    local_320._12_4_ = auVar134._12_4_ + auVar134._12_4_;
    local_320._16_4_ = auVar134._16_4_ + auVar134._16_4_;
    local_320._20_4_ = auVar134._20_4_ + auVar134._20_4_;
    local_320._24_4_ = auVar134._24_4_ + auVar134._24_4_;
    fVar211 = auVar134._28_4_;
    local_320._28_4_ = fVar211 + fVar211;
    auVar17 = vsubps_avx(auVar159,auVar49);
    auVar158 = ZEXT1632(auVar7);
    auVar50._28_4_ = 0x3f800002;
    auVar50._0_28_ =
         ZEXT1628(CONCAT412(fVar188 * fVar188,
                            CONCAT48(fVar169 * fVar169,CONCAT44(fVar150 * fVar150,fVar149 * fVar149)
                                    )));
    auVar134 = vsubps_avx(local_260,auVar50);
    auVar51._4_4_ = local_320._4_4_ * local_320._4_4_;
    auVar51._0_4_ = local_320._0_4_ * local_320._0_4_;
    auVar51._8_4_ = local_320._8_4_ * local_320._8_4_;
    auVar51._12_4_ = local_320._12_4_ * local_320._12_4_;
    auVar51._16_4_ = local_320._16_4_ * local_320._16_4_;
    auVar51._20_4_ = local_320._20_4_ * local_320._20_4_;
    auVar51._24_4_ = local_320._24_4_ * local_320._24_4_;
    auVar51._28_4_ = local_260._28_4_;
    fVar234 = auVar134._0_4_;
    fVar251 = auVar134._4_4_;
    fVar252 = auVar134._8_4_;
    fVar253 = auVar134._12_4_;
    fVar254 = auVar134._16_4_;
    fVar255 = auVar134._20_4_;
    fVar149 = auVar134._24_4_;
    auVar52._4_4_ = auVar17._4_4_ * fVar251 * 4.0;
    auVar52._0_4_ = auVar17._0_4_ * fVar234 * 4.0;
    auVar52._8_4_ = auVar17._8_4_ * fVar252 * 4.0;
    auVar52._12_4_ = auVar17._12_4_ * fVar253 * 4.0;
    auVar52._16_4_ = auVar17._16_4_ * fVar254 * 4.0;
    auVar52._20_4_ = auVar17._20_4_ * fVar255 * 4.0;
    auVar52._24_4_ = auVar17._24_4_ * fVar149 * 4.0;
    auVar52._28_4_ = fVar211;
    auVar16 = vsubps_avx(auVar51,auVar52);
    auVar125 = vcmpps_avx(auVar16,auVar130,5);
    _local_b60 = vandps_avx(auVar50,local_8c0);
    local_ac0._0_4_ = fVar234 + fVar234;
    local_ac0._4_4_ = fVar251 + fVar251;
    local_ac0._8_4_ = fVar252 + fVar252;
    local_ac0._12_4_ = fVar253 + fVar253;
    local_ac0._16_4_ = fVar254 + fVar254;
    local_ac0._20_4_ = fVar255 + fVar255;
    local_ac0._24_4_ = fVar149 + fVar149;
    local_ac0._28_4_ = auVar134._28_4_ + auVar134._28_4_;
    local_3c0 = vandps_avx(auVar134,local_8c0);
    auVar134 = ZEXT1632(auVar6);
    if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar125 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar125 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar125 >> 0x7f,0) == '\0') &&
          (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar125 >> 0xbf,0) == '\0') &&
        (auVar125 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar125[0x1f])
    {
      auVar299._8_4_ = 0x7f800000;
      auVar299._0_8_ = 0x7f8000007f800000;
      auVar299._12_4_ = 0x7f800000;
      auVar299._16_4_ = 0x7f800000;
      auVar299._20_4_ = 0x7f800000;
      auVar299._24_4_ = 0x7f800000;
      auVar299._28_4_ = 0x7f800000;
      auVar224._8_4_ = 0xff800000;
      auVar224._0_8_ = 0xff800000ff800000;
      auVar224._12_4_ = 0xff800000;
      auVar224._16_4_ = 0xff800000;
      auVar224._20_4_ = 0xff800000;
      auVar224._24_4_ = 0xff800000;
      auVar224._28_4_ = 0xff800000;
    }
    else {
      auVar207 = vsqrtps_avx(auVar16);
      auVar181 = vrcpps_avx(local_ac0);
      auVar16 = vcmpps_avx(auVar16,auVar130,5);
      auVar131._8_4_ = 0x3f800000;
      auVar131._0_8_ = 0x3f8000003f800000;
      auVar131._12_4_ = 0x3f800000;
      auVar131._16_4_ = 0x3f800000;
      auVar131._20_4_ = 0x3f800000;
      auVar131._24_4_ = 0x3f800000;
      auVar131._28_4_ = 0x3f800000;
      auVar6 = vfnmadd213ps_fma(auVar181,local_ac0,auVar131);
      auVar6 = vfmadd132ps_fma(ZEXT1632(auVar6),auVar181,auVar181);
      uVar102 = CONCAT44(local_320._4_4_,local_320._0_4_);
      auVar313._0_8_ = uVar102 ^ 0x8000000080000000;
      auVar313._8_4_ = -local_320._8_4_;
      auVar313._12_4_ = -local_320._12_4_;
      auVar313._16_4_ = -local_320._16_4_;
      auVar313._20_4_ = -local_320._20_4_;
      auVar313._24_4_ = -local_320._24_4_;
      auVar313._28_4_ = -local_320._28_4_;
      auVar130 = vsubps_avx(auVar313,auVar207);
      auVar53._4_4_ = auVar130._4_4_ * auVar6._4_4_;
      auVar53._0_4_ = auVar130._0_4_ * auVar6._0_4_;
      auVar53._8_4_ = auVar130._8_4_ * auVar6._8_4_;
      auVar53._12_4_ = auVar130._12_4_ * auVar6._12_4_;
      auVar53._16_4_ = auVar130._16_4_ * 0.0;
      auVar53._20_4_ = auVar130._20_4_ * 0.0;
      auVar53._24_4_ = auVar130._24_4_ * 0.0;
      auVar53._28_4_ = auVar130._28_4_;
      auVar130 = vsubps_avx(auVar207,local_320);
      auVar225._0_4_ = auVar130._0_4_ * auVar6._0_4_;
      auVar225._4_4_ = auVar130._4_4_ * auVar6._4_4_;
      auVar225._8_4_ = auVar130._8_4_ * auVar6._8_4_;
      auVar225._12_4_ = auVar130._12_4_ * auVar6._12_4_;
      auVar225._16_4_ = auVar130._16_4_ * 0.0;
      auVar225._20_4_ = auVar130._20_4_ * 0.0;
      auVar225._24_4_ = auVar130._24_4_ * 0.0;
      auVar225._28_4_ = 0;
      auVar6 = vfmadd213ps_fma(auVar158,auVar53,auVar134);
      local_3a0 = auVar6._0_4_ * fVar232;
      fStack_39c = auVar6._4_4_ * fVar233;
      fStack_398 = auVar6._8_4_ * fVar191;
      fStack_394 = auVar6._12_4_ * fVar264;
      uStack_390 = 0;
      uStack_38c = 0;
      uStack_388 = 0;
      uStack_384 = 0x80000000;
      auVar6 = vfmadd213ps_fma(auVar158,auVar225,auVar134);
      local_380 = auVar6._0_4_ * fVar232;
      fStack_37c = auVar6._4_4_ * fVar233;
      fStack_378 = auVar6._8_4_ * fVar191;
      fStack_374 = auVar6._12_4_ * fVar264;
      uStack_370 = 0;
      uStack_36c = 0;
      uStack_368 = 0;
      uStack_364 = 0x80000000;
      auVar132._8_4_ = 0x7f800000;
      auVar132._0_8_ = 0x7f8000007f800000;
      auVar132._12_4_ = 0x7f800000;
      auVar132._16_4_ = 0x7f800000;
      auVar132._20_4_ = 0x7f800000;
      auVar132._24_4_ = 0x7f800000;
      auVar132._28_4_ = 0x7f800000;
      auVar299 = vblendvps_avx(auVar132,auVar53,auVar16);
      auVar133._8_4_ = 0xff800000;
      auVar133._0_8_ = 0xff800000ff800000;
      auVar133._12_4_ = 0xff800000;
      auVar133._16_4_ = 0xff800000;
      auVar133._20_4_ = 0xff800000;
      auVar133._24_4_ = 0xff800000;
      auVar133._28_4_ = 0xff800000;
      auVar224 = vblendvps_avx(auVar133,auVar225,auVar16);
      auVar130 = vmaxps_avx(local_740,_local_b60);
      auVar54._4_4_ = auVar130._4_4_ * 1.9073486e-06;
      auVar54._0_4_ = auVar130._0_4_ * 1.9073486e-06;
      auVar54._8_4_ = auVar130._8_4_ * 1.9073486e-06;
      auVar54._12_4_ = auVar130._12_4_ * 1.9073486e-06;
      auVar54._16_4_ = auVar130._16_4_ * 1.9073486e-06;
      auVar54._20_4_ = auVar130._20_4_ * 1.9073486e-06;
      auVar54._24_4_ = auVar130._24_4_ * 1.9073486e-06;
      auVar54._28_4_ = auVar130._28_4_;
      auVar130 = vcmpps_avx(local_3c0,auVar54,1);
      auVar181 = auVar16 & auVar130;
      if ((((((((auVar181 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar181 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar181 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar181 >> 0x7f,0) != '\0') ||
            (auVar181 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar181 >> 0xbf,0) != '\0') ||
          (auVar181 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar181[0x1f] < '\0') {
        auVar125 = vandps_avx(auVar130,auVar16);
        auVar130 = vcmpps_avx(auVar17,_DAT_01f7b000,2);
        auVar142._8_4_ = 0x7f800000;
        auVar142._0_8_ = 0x7f8000007f800000;
        auVar142._12_4_ = 0x7f800000;
        auVar142._16_4_ = 0x7f800000;
        auVar142._20_4_ = 0x7f800000;
        auVar142._24_4_ = 0x7f800000;
        auVar142._28_4_ = 0x7f800000;
        auVar314._8_4_ = 0xff800000;
        auVar314._0_8_ = 0xff800000ff800000;
        auVar314._12_4_ = 0xff800000;
        auVar314._16_4_ = 0xff800000;
        auVar314._20_4_ = 0xff800000;
        auVar314._24_4_ = 0xff800000;
        auVar314._28_4_ = 0xff800000;
        auVar17 = vblendvps_avx(auVar142,auVar314,auVar130);
        auVar6 = vpackssdw_avx(auVar125._0_16_,auVar125._16_16_);
        auVar181 = vpmovsxwd_avx2(auVar6);
        auVar299 = vblendvps_avx(auVar299,auVar17,auVar181);
        auVar143._8_4_ = 0xff800000;
        auVar143._0_8_ = 0xff800000ff800000;
        auVar143._12_4_ = 0xff800000;
        auVar143._16_4_ = 0xff800000;
        auVar143._20_4_ = 0xff800000;
        auVar143._24_4_ = 0xff800000;
        auVar143._28_4_ = 0xff800000;
        auVar315._8_4_ = 0x7f800000;
        auVar315._0_8_ = 0x7f8000007f800000;
        auVar315._12_4_ = 0x7f800000;
        auVar315._16_4_ = 0x7f800000;
        auVar315._20_4_ = 0x7f800000;
        auVar315._24_4_ = 0x7f800000;
        auVar315._28_4_ = 0x7f800000;
        auVar17 = vblendvps_avx(auVar143,auVar315,auVar130);
        auVar224 = vblendvps_avx(auVar224,auVar17,auVar181);
        auVar249._0_8_ = auVar125._0_8_ ^ 0xffffffffffffffff;
        auVar249._8_4_ = auVar125._8_4_ ^ 0xffffffff;
        auVar249._12_4_ = auVar125._12_4_ ^ 0xffffffff;
        auVar249._16_4_ = auVar125._16_4_ ^ 0xffffffff;
        auVar249._20_4_ = auVar125._20_4_ ^ 0xffffffff;
        auVar249._24_4_ = auVar125._24_4_ ^ 0xffffffff;
        auVar249._28_4_ = auVar125._28_4_ ^ 0xffffffff;
        auVar125 = vorps_avx(auVar130,auVar249);
        auVar125 = vandps_avx(auVar16,auVar125);
      }
    }
    auVar281 = ZEXT3264(_DAT_01f7b040);
    auVar302 = ZEXT3264(auVar299);
    auVar17 = local_860 & auVar125;
    auVar292 = ZEXT3264(_local_a00);
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar17 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar17 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar17 >> 0x7f,0) == '\0') &&
          (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar17 >> 0xbf,0) == '\0') &&
        (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar17[0x1f]) {
      auVar231 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                                                                                                          
                                                  0x3f8000003f800000)))))));
    }
    else {
      local_3e0 = ZEXT1632(auVar271);
      auVar281 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x100));
      fVar211 = *(float *)(ray + k * 4 + 0x100) - (float)local_a40._0_4_;
      auVar276._4_4_ = fVar211;
      auVar276._0_4_ = fVar211;
      auVar276._8_4_ = fVar211;
      auVar276._12_4_ = fVar211;
      auVar276._16_4_ = fVar211;
      auVar276._20_4_ = fVar211;
      auVar276._24_4_ = fVar211;
      auVar276._28_4_ = fVar211;
      auVar130 = vminps_avx(auVar276,auVar224);
      auVar73._4_4_ = auVar298._4_4_ * fVar263;
      auVar73._0_4_ = auVar298._0_4_ * fVar262;
      auVar73._8_4_ = auVar298._8_4_ * fVar111;
      auVar73._12_4_ = auVar298._12_4_ * fVar145;
      auVar73._16_4_ = auVar298._16_4_ * fVar146;
      auVar73._20_4_ = auVar298._20_4_ * fVar147;
      auVar73._24_4_ = auVar298._24_4_ * fVar148;
      auVar73._28_4_ = auVar224._28_4_;
      auVar271 = vfmadd213ps_fma(auVar129,local_900,auVar73);
      auVar95._4_4_ = fStack_33c;
      auVar95._0_4_ = local_340;
      auVar95._8_4_ = fStack_338;
      auVar95._12_4_ = fStack_334;
      auVar95._16_4_ = fStack_330;
      auVar95._20_4_ = fStack_32c;
      auVar95._24_4_ = fStack_328;
      auVar95._28_4_ = fStack_324;
      auVar16 = vmaxps_avx(auVar95,auVar299);
      auVar6 = vfmadd213ps_fma(auVar15,local_a80,ZEXT1632(auVar271));
      auVar258._0_4_ = auVar298._0_4_ * (float)local_8a0._0_4_;
      auVar258._4_4_ = auVar298._4_4_ * (float)local_8a0._4_4_;
      auVar258._8_4_ = auVar298._8_4_ * fStack_898;
      auVar258._12_4_ = auVar298._12_4_ * fStack_894;
      auVar258._16_4_ = auVar298._16_4_ * fStack_890;
      auVar258._20_4_ = auVar298._20_4_ * fStack_88c;
      auVar258._24_4_ = auVar298._24_4_ * fStack_888;
      auVar258._28_4_ = 0;
      auVar302 = ZEXT3264(_local_880);
      auVar271 = vfmadd231ps_fma(auVar258,_local_880,local_900);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar271),local_a80,_local_980);
      auVar17 = vandps_avx(ZEXT1632(auVar7),local_8c0);
      auVar309._8_4_ = 0x219392ef;
      auVar309._0_8_ = 0x219392ef219392ef;
      auVar309._12_4_ = 0x219392ef;
      auVar309._16_4_ = 0x219392ef;
      auVar309._20_4_ = 0x219392ef;
      auVar309._24_4_ = 0x219392ef;
      auVar309._28_4_ = 0x219392ef;
      auVar129 = vcmpps_avx(auVar17,auVar309,1);
      auVar17 = vrcpps_avx(ZEXT1632(auVar7));
      auVar277._8_4_ = 0x3f800000;
      auVar277._0_8_ = 0x3f8000003f800000;
      auVar277._12_4_ = 0x3f800000;
      auVar277._16_4_ = 0x3f800000;
      auVar277._20_4_ = 0x3f800000;
      auVar277._24_4_ = 0x3f800000;
      auVar277._28_4_ = 0x3f800000;
      auVar181 = ZEXT1632(auVar7);
      auVar271 = vfnmadd213ps_fma(auVar17,auVar181,auVar277);
      auVar271 = vfmadd132ps_fma(ZEXT1632(auVar271),auVar17,auVar17);
      auVar310._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
      auVar310._8_4_ = auVar7._8_4_ ^ 0x80000000;
      auVar310._12_4_ = auVar7._12_4_ ^ 0x80000000;
      auVar310._16_4_ = 0x80000000;
      auVar310._20_4_ = 0x80000000;
      auVar310._24_4_ = 0x80000000;
      auVar310._28_4_ = 0x80000000;
      auVar55._4_4_ = auVar271._4_4_ * -auVar6._4_4_;
      auVar55._0_4_ = auVar271._0_4_ * -auVar6._0_4_;
      auVar55._8_4_ = auVar271._8_4_ * -auVar6._8_4_;
      auVar55._12_4_ = auVar271._12_4_ * -auVar6._12_4_;
      auVar55._16_4_ = 0x80000000;
      auVar55._20_4_ = 0x80000000;
      auVar55._24_4_ = 0x80000000;
      auVar55._28_4_ = 0x80000000;
      auVar17 = vcmpps_avx(auVar181,auVar310,1);
      auVar17 = vorps_avx(auVar129,auVar17);
      auVar278._8_4_ = 0xff800000;
      auVar278._0_8_ = 0xff800000ff800000;
      auVar278._12_4_ = 0xff800000;
      auVar278._16_4_ = 0xff800000;
      auVar278._20_4_ = 0xff800000;
      auVar278._24_4_ = 0xff800000;
      auVar278._28_4_ = 0xff800000;
      auVar17 = vblendvps_avx(auVar55,auVar278,auVar17);
      auVar15 = vmaxps_avx(auVar16,auVar17);
      auVar17 = vcmpps_avx(auVar181,auVar310,6);
      auVar17 = vorps_avx(auVar129,auVar17);
      auVar268._8_4_ = 0x7f800000;
      auVar268._0_8_ = 0x7f8000007f800000;
      auVar268._12_4_ = 0x7f800000;
      auVar268._16_4_ = 0x7f800000;
      auVar268._20_4_ = 0x7f800000;
      auVar268._24_4_ = 0x7f800000;
      auVar268._28_4_ = 0x7f800000;
      auVar17 = vblendvps_avx(auVar55,auVar268,auVar17);
      auVar16 = vminps_avx(auVar130,auVar17);
      fVar211 = -local_b00._0_4_;
      fVar262 = -local_b00._4_4_;
      fVar263 = -local_b00._8_4_;
      fVar111 = -local_b00._12_4_;
      fVar145 = -local_b00._16_4_;
      fVar146 = -local_b00._20_4_;
      fVar147 = -local_b00._24_4_;
      auVar269._0_8_ = local_b20._0_8_ ^ 0x8000000080000000;
      auVar269._8_4_ = -local_b20._8_4_;
      auVar269._12_4_ = -local_b20._12_4_;
      auVar269._16_4_ = -local_b20._16_4_;
      auVar269._20_4_ = -local_b20._20_4_;
      auVar269._24_4_ = -local_b20._24_4_;
      auVar269._28_4_ = local_b20._28_4_ ^ 0x80000000;
      auVar74 = ZEXT812(0);
      auVar130 = ZEXT1232(auVar74) << 0x20;
      auVar17 = vsubps_avx(ZEXT1232(auVar74) << 0x20,local_ba0);
      auVar129 = vsubps_avx(ZEXT1232(auVar74) << 0x20,local_8e0);
      auVar56._4_4_ = auVar129._4_4_ * fVar262;
      auVar56._0_4_ = auVar129._0_4_ * fVar211;
      auVar56._8_4_ = auVar129._8_4_ * fVar263;
      auVar56._12_4_ = auVar129._12_4_ * fVar111;
      auVar56._16_4_ = auVar129._16_4_ * fVar145;
      auVar56._20_4_ = auVar129._20_4_ * fVar146;
      auVar56._24_4_ = auVar129._24_4_ * fVar147;
      auVar56._28_4_ = auVar129._28_4_;
      auVar271 = vfmadd231ps_fma(auVar56,auVar269,auVar17);
      uStack_c24 = auVar259._28_4_;
      auVar279._0_8_ = auVar259._0_8_ ^ 0x8000000080000000;
      auVar279._8_4_ = -auVar259._8_4_;
      auVar279._12_4_ = -auVar259._12_4_;
      auVar279._16_4_ = -auVar259._16_4_;
      auVar279._20_4_ = -auVar259._20_4_;
      auVar279._24_4_ = -auVar259._24_4_;
      auVar279._28_4_ = uStack_c24 ^ 0x80000000;
      auVar17 = vsubps_avx(ZEXT1232(auVar74) << 0x20,auVar124);
      auVar6 = vfmadd231ps_fma(ZEXT1632(auVar271),auVar279,auVar17);
      auVar57._4_4_ = (float)local_8a0._4_4_ * fVar262;
      auVar57._0_4_ = (float)local_8a0._0_4_ * fVar211;
      auVar57._8_4_ = fStack_898 * fVar263;
      auVar57._12_4_ = fStack_894 * fVar111;
      auVar57._16_4_ = fStack_890 * fVar145;
      auVar57._20_4_ = fStack_88c * fVar146;
      auVar57._24_4_ = fStack_888 * fVar147;
      auVar57._28_4_ = local_b00._28_4_ ^ 0x80000000;
      auVar271 = vfmadd231ps_fma(auVar57,_local_880,auVar269);
      auVar228._8_4_ = 0x3f800000;
      auVar228._0_8_ = 0x3f8000003f800000;
      auVar228._12_4_ = 0x3f800000;
      auVar228._16_4_ = 0x3f800000;
      auVar228._20_4_ = 0x3f800000;
      auVar228._24_4_ = 0x3f800000;
      auVar228._28_4_ = 0x3f800000;
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar271),auVar279,_local_980);
      auVar17 = vandps_avx(ZEXT1632(auVar7),local_8c0);
      auVar124 = vrcpps_avx(ZEXT1632(auVar7));
      auVar226._8_4_ = 0x219392ef;
      auVar226._0_8_ = 0x219392ef219392ef;
      auVar226._12_4_ = 0x219392ef;
      auVar226._16_4_ = 0x219392ef;
      auVar226._20_4_ = 0x219392ef;
      auVar226._24_4_ = 0x219392ef;
      auVar226._28_4_ = 0x219392ef;
      auVar129 = vcmpps_avx(auVar17,auVar226,1);
      auVar259 = ZEXT1632(auVar7);
      auVar271 = vfnmadd213ps_fma(auVar124,auVar259,auVar228);
      auVar271 = vfmadd132ps_fma(ZEXT1632(auVar271),auVar124,auVar124);
      auVar280._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
      auVar280._8_4_ = auVar7._8_4_ ^ 0x80000000;
      auVar280._12_4_ = auVar7._12_4_ ^ 0x80000000;
      auVar280._16_4_ = 0x80000000;
      auVar280._20_4_ = 0x80000000;
      auVar280._24_4_ = 0x80000000;
      auVar280._28_4_ = 0x80000000;
      auVar58._4_4_ = auVar271._4_4_ * -auVar6._4_4_;
      auVar58._0_4_ = auVar271._0_4_ * -auVar6._0_4_;
      auVar58._8_4_ = auVar271._8_4_ * -auVar6._8_4_;
      auVar58._12_4_ = auVar271._12_4_ * -auVar6._12_4_;
      auVar58._16_4_ = 0x80000000;
      auVar58._20_4_ = 0x80000000;
      auVar58._24_4_ = 0x80000000;
      auVar58._28_4_ = 0x80000000;
      auVar17 = vcmpps_avx(auVar259,auVar280,1);
      auVar17 = vorps_avx(auVar129,auVar17);
      auVar227._8_4_ = 0xff800000;
      auVar227._0_8_ = 0xff800000ff800000;
      auVar227._12_4_ = 0xff800000;
      auVar227._16_4_ = 0xff800000;
      auVar227._20_4_ = 0xff800000;
      auVar227._24_4_ = 0xff800000;
      auVar227._28_4_ = 0xff800000;
      auVar17 = vblendvps_avx(auVar58,auVar227,auVar17);
      local_a20 = vmaxps_avx(auVar15,auVar17);
      auVar17 = vcmpps_avx(auVar259,auVar280,6);
      auVar17 = vorps_avx(auVar129,auVar17);
      auVar260._8_4_ = 0x7f800000;
      auVar260._0_8_ = 0x7f8000007f800000;
      auVar260._12_4_ = 0x7f800000;
      auVar260._16_4_ = 0x7f800000;
      auVar260._20_4_ = 0x7f800000;
      auVar260._24_4_ = 0x7f800000;
      auVar260._28_4_ = 0x7f800000;
      auVar17 = vblendvps_avx(auVar58,auVar260,auVar17);
      auVar125 = vandps_avx(auVar125,local_860);
      local_400 = vminps_avx(auVar16,auVar17);
      auVar17 = vcmpps_avx(local_a20,local_400,2);
      auVar261 = ZEXT3264(auVar17);
      auVar129 = auVar125 & auVar17;
      auVar15 = auVar228;
      if ((((((((auVar129 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar129 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar129 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar129 >> 0x7f,0) != '\0') ||
            (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar129 >> 0xbf,0) != '\0') ||
          (auVar129 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar129[0x1f] < '\0') {
        auVar93._4_4_ = fStack_39c;
        auVar93._0_4_ = local_3a0;
        auVar93._8_4_ = fStack_398;
        auVar93._12_4_ = fStack_394;
        auVar93._16_4_ = uStack_390;
        auVar93._20_4_ = uStack_38c;
        auVar93._24_4_ = uStack_388;
        auVar93._28_4_ = uStack_384;
        auVar129 = vminps_avx(auVar93,auVar228);
        auVar129 = vmaxps_avx(auVar129,ZEXT832(0) << 0x20);
        auVar94._4_4_ = fStack_37c;
        auVar94._0_4_ = local_380;
        auVar94._8_4_ = fStack_378;
        auVar94._12_4_ = fStack_374;
        auVar94._16_4_ = uStack_370;
        auVar94._20_4_ = uStack_36c;
        auVar94._24_4_ = uStack_368;
        auVar94._28_4_ = uStack_364;
        auVar15 = vminps_avx(auVar94,auVar228);
        auVar15 = vmaxps_avx(auVar15,ZEXT832(0) << 0x20);
        auVar59._4_4_ = (auVar129._4_4_ + 1.0) * 0.125;
        auVar59._0_4_ = (auVar129._0_4_ + 0.0) * 0.125;
        auVar59._8_4_ = (auVar129._8_4_ + 2.0) * 0.125;
        auVar59._12_4_ = (auVar129._12_4_ + 3.0) * 0.125;
        auVar59._16_4_ = (auVar129._16_4_ + 4.0) * 0.125;
        auVar59._20_4_ = (auVar129._20_4_ + 5.0) * 0.125;
        auVar59._24_4_ = (auVar129._24_4_ + 6.0) * 0.125;
        auVar59._28_4_ = auVar129._28_4_ + 7.0;
        auVar271 = vfmadd213ps_fma(auVar59,local_940,local_920);
        auVar60._4_4_ = (auVar15._4_4_ + 1.0) * 0.125;
        auVar60._0_4_ = (auVar15._0_4_ + 0.0) * 0.125;
        auVar60._8_4_ = (auVar15._8_4_ + 2.0) * 0.125;
        auVar60._12_4_ = (auVar15._12_4_ + 3.0) * 0.125;
        auVar60._16_4_ = (auVar15._16_4_ + 4.0) * 0.125;
        auVar60._20_4_ = (auVar15._20_4_ + 5.0) * 0.125;
        auVar60._24_4_ = (auVar15._24_4_ + 6.0) * 0.125;
        auVar60._28_4_ = auVar15._28_4_ + 7.0;
        auVar6 = vfmadd213ps_fma(auVar60,local_940,local_920);
        auVar129 = vminps_avx(auVar157,local_960);
        auVar15 = vminps_avx(auVar18,auVar19);
        auVar129 = vminps_avx(auVar129,auVar15);
        auVar187 = vsubps_avx(auVar129,auVar187);
        auVar125 = vandps_avx(auVar17,auVar125);
        local_1a0 = ZEXT1632(auVar271);
        local_1c0 = ZEXT1632(auVar6);
        auVar61._4_4_ = auVar187._4_4_ * 0.99999976;
        auVar61._0_4_ = auVar187._0_4_ * 0.99999976;
        auVar61._8_4_ = auVar187._8_4_ * 0.99999976;
        auVar61._12_4_ = auVar187._12_4_ * 0.99999976;
        auVar61._16_4_ = auVar187._16_4_ * 0.99999976;
        auVar61._20_4_ = auVar187._20_4_ * 0.99999976;
        auVar61._24_4_ = auVar187._24_4_ * 0.99999976;
        auVar61._28_4_ = auVar187._28_4_;
        auVar187 = vmaxps_avx(ZEXT1232(auVar74) << 0x20,auVar61);
        auVar62._4_4_ = auVar187._4_4_ * auVar187._4_4_;
        auVar62._0_4_ = auVar187._0_4_ * auVar187._0_4_;
        auVar62._8_4_ = auVar187._8_4_ * auVar187._8_4_;
        auVar62._12_4_ = auVar187._12_4_ * auVar187._12_4_;
        auVar62._16_4_ = auVar187._16_4_ * auVar187._16_4_;
        auVar62._20_4_ = auVar187._20_4_ * auVar187._20_4_;
        auVar62._24_4_ = auVar187._24_4_ * auVar187._24_4_;
        auVar62._28_4_ = auVar187._28_4_;
        auVar129 = vsubps_avx(auVar159,auVar62);
        auVar63._4_4_ = auVar129._4_4_ * fVar251 * 4.0;
        auVar63._0_4_ = auVar129._0_4_ * fVar234 * 4.0;
        auVar63._8_4_ = auVar129._8_4_ * fVar252 * 4.0;
        auVar63._12_4_ = auVar129._12_4_ * fVar253 * 4.0;
        auVar63._16_4_ = auVar129._16_4_ * fVar254 * 4.0;
        auVar63._20_4_ = auVar129._20_4_ * fVar255 * 4.0;
        auVar63._24_4_ = auVar129._24_4_ * fVar149 * 4.0;
        auVar63._28_4_ = auVar187._28_4_;
        auVar15 = vsubps_avx(auVar51,auVar63);
        auVar187 = vcmpps_avx(auVar15,ZEXT832(0) << 0x20,5);
        if ((((((((auVar187 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar187 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar187 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar187 >> 0x7f,0) == '\0') &&
              (auVar187 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar187 >> 0xbf,0) == '\0') &&
            (auVar187 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar187[0x1f]) {
          auVar261 = ZEXT864(0) << 0x20;
          auVar274 = ZEXT1228(ZEXT812(0)) << 0x20;
          auVar134 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar159 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar311 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar300._8_4_ = 0x7f800000;
          auVar300._0_8_ = 0x7f8000007f800000;
          auVar300._12_4_ = 0x7f800000;
          auVar300._16_4_ = 0x7f800000;
          auVar300._20_4_ = 0x7f800000;
          auVar300._24_4_ = 0x7f800000;
          auVar300._28_4_ = 0x7f800000;
          auVar304._8_4_ = 0xff800000;
          auVar304._0_8_ = 0xff800000ff800000;
          auVar304._12_4_ = 0xff800000;
          auVar304._16_4_ = 0xff800000;
          auVar304._20_4_ = 0xff800000;
          auVar304._24_4_ = 0xff800000;
          auVar304._28_4_ = 0xff800000;
        }
        else {
          auVar159 = vrcpps_avx(local_ac0);
          auVar135._8_4_ = 0x3f800000;
          auVar135._0_8_ = 0x3f8000003f800000;
          auVar135._12_4_ = 0x3f800000;
          auVar135._16_4_ = 0x3f800000;
          auVar135._20_4_ = 0x3f800000;
          auVar135._24_4_ = 0x3f800000;
          auVar135._28_4_ = 0x3f800000;
          auVar271 = vfnmadd213ps_fma(local_ac0,auVar159,auVar135);
          auVar16 = vsqrtps_avx(auVar15);
          auVar271 = vfmadd132ps_fma(ZEXT1632(auVar271),auVar159,auVar159);
          uVar102 = CONCAT44(local_320._4_4_,local_320._0_4_);
          auVar241._0_8_ = uVar102 ^ 0x8000000080000000;
          auVar241._8_4_ = -local_320._8_4_;
          auVar241._12_4_ = -local_320._12_4_;
          auVar241._16_4_ = -local_320._16_4_;
          auVar241._20_4_ = -local_320._20_4_;
          auVar241._24_4_ = -local_320._24_4_;
          auVar241._28_4_ = -local_320._28_4_;
          auVar159 = vsubps_avx(auVar241,auVar16);
          auVar16 = vsubps_avx(auVar16,local_320);
          fVar211 = auVar159._0_4_ * auVar271._0_4_;
          fVar234 = auVar159._4_4_ * auVar271._4_4_;
          auVar64._4_4_ = fVar234;
          auVar64._0_4_ = fVar211;
          fVar251 = auVar159._8_4_ * auVar271._8_4_;
          auVar64._8_4_ = fVar251;
          fVar252 = auVar159._12_4_ * auVar271._12_4_;
          auVar64._12_4_ = fVar252;
          fVar253 = auVar159._16_4_ * 0.0;
          auVar64._16_4_ = fVar253;
          fVar254 = auVar159._20_4_ * 0.0;
          auVar64._20_4_ = fVar254;
          fVar255 = auVar159._24_4_ * 0.0;
          auVar64._24_4_ = fVar255;
          auVar64._28_4_ = auVar159._28_4_;
          fVar262 = auVar16._0_4_ * auVar271._0_4_;
          fVar263 = auVar16._4_4_ * auVar271._4_4_;
          auVar65._4_4_ = fVar263;
          auVar65._0_4_ = fVar262;
          fVar111 = auVar16._8_4_ * auVar271._8_4_;
          auVar65._8_4_ = fVar111;
          fVar145 = auVar16._12_4_ * auVar271._12_4_;
          auVar65._12_4_ = fVar145;
          fVar146 = auVar16._16_4_ * 0.0;
          auVar65._16_4_ = fVar146;
          fVar147 = auVar16._20_4_ * 0.0;
          auVar65._20_4_ = fVar147;
          fVar148 = auVar16._24_4_ * 0.0;
          auVar65._24_4_ = fVar148;
          auVar65._28_4_ = uVar151;
          auVar271 = vfmadd213ps_fma(auVar158,auVar64,auVar134);
          auVar6 = vfmadd213ps_fma(auVar158,auVar65,auVar134);
          auVar134 = ZEXT1632(CONCAT412(fVar264 * auVar271._12_4_,
                                        CONCAT48(fVar191 * auVar271._8_4_,
                                                 CONCAT44(fVar233 * auVar271._4_4_,
                                                          fVar232 * auVar271._0_4_))));
          auVar66._28_4_ = auVar17._28_4_;
          auVar66._0_28_ =
               ZEXT1628(CONCAT412(auVar6._12_4_ * fVar264,
                                  CONCAT48(auVar6._8_4_ * fVar191,
                                           CONCAT44(auVar6._4_4_ * fVar233,auVar6._0_4_ * fVar232)))
                       );
          auVar271 = vfmadd213ps_fma(local_2e0,auVar134,auVar127);
          auVar6 = vfmadd213ps_fma(local_2e0,auVar66,auVar127);
          auVar7 = vfmadd213ps_fma(local_300,auVar134,local_2a0);
          auVar116 = vfmadd213ps_fma(local_300,auVar66,local_2a0);
          auVar308 = vfmadd213ps_fma(auVar134,local_2c0,auVar126);
          auVar295 = vfmadd213ps_fma(local_2c0,auVar66,auVar126);
          auVar67._4_4_ = (float)local_980._4_4_ * fVar234;
          auVar67._0_4_ = (float)local_980._0_4_ * fVar211;
          auVar67._8_4_ = fStack_978 * fVar251;
          auVar67._12_4_ = fStack_974 * fVar252;
          auVar67._16_4_ = fStack_970 * fVar253;
          auVar67._20_4_ = fStack_96c * fVar254;
          auVar67._24_4_ = fStack_968 * fVar255;
          auVar67._28_4_ = 0;
          auVar134 = vsubps_avx(auVar67,ZEXT1632(auVar271));
          auVar68._4_4_ = (float)local_880._4_4_ * fVar234;
          auVar68._0_4_ = (float)local_880._0_4_ * fVar211;
          auVar68._8_4_ = fStack_878 * fVar251;
          auVar68._12_4_ = fStack_874 * fVar252;
          auVar68._16_4_ = fStack_870 * fVar253;
          auVar68._20_4_ = fStack_86c * fVar254;
          auVar68._24_4_ = fStack_868 * fVar255;
          auVar68._28_4_ = 0x80000000;
          auVar159 = vsubps_avx(auVar68,ZEXT1632(auVar7));
          auVar183._0_4_ = (float)local_8a0._0_4_ * fVar211;
          auVar183._4_4_ = (float)local_8a0._4_4_ * fVar234;
          auVar183._8_4_ = fStack_898 * fVar251;
          auVar183._12_4_ = fStack_894 * fVar252;
          auVar183._16_4_ = fStack_890 * fVar253;
          auVar183._20_4_ = fStack_88c * fVar254;
          auVar183._24_4_ = fStack_888 * fVar255;
          auVar183._28_4_ = 0;
          auVar16 = vsubps_avx(auVar183,ZEXT1632(auVar308));
          auVar247._0_4_ = fVar262 * (float)local_980._0_4_;
          auVar247._4_4_ = fVar263 * (float)local_980._4_4_;
          auVar247._8_4_ = fVar111 * fStack_978;
          auVar247._12_4_ = fVar145 * fStack_974;
          auVar247._16_4_ = fVar146 * fStack_970;
          auVar247._20_4_ = fVar147 * fStack_96c;
          auVar247._24_4_ = fVar148 * fStack_968;
          auVar247._28_4_ = 0;
          auVar130 = vsubps_avx(auVar247,ZEXT1632(auVar6));
          auVar69._4_4_ = (float)local_880._4_4_ * fVar263;
          auVar69._0_4_ = (float)local_880._0_4_ * fVar262;
          auVar69._8_4_ = fStack_878 * fVar111;
          auVar69._12_4_ = fStack_874 * fVar145;
          auVar69._16_4_ = fStack_870 * fVar146;
          auVar69._20_4_ = fStack_86c * fVar147;
          auVar69._24_4_ = fStack_868 * fVar148;
          auVar69._28_4_ = uStack_964;
          auVar17 = vsubps_avx(auVar69,ZEXT1632(auVar116));
          auVar261 = ZEXT3264(auVar17);
          auVar70._4_4_ = (float)local_8a0._4_4_ * fVar263;
          auVar70._0_4_ = (float)local_8a0._0_4_ * fVar262;
          auVar70._8_4_ = fStack_898 * fVar111;
          auVar70._12_4_ = fStack_894 * fVar145;
          auVar70._16_4_ = fStack_890 * fVar146;
          auVar70._20_4_ = fStack_88c * fVar147;
          auVar70._24_4_ = fStack_888 * fVar148;
          auVar70._28_4_ = uVar110;
          auVar17 = vsubps_avx(auVar70,ZEXT1632(auVar295));
          auVar274 = auVar17._0_28_;
          auVar17 = vcmpps_avx(auVar15,_DAT_01f7b000,5);
          auVar301._8_4_ = 0x7f800000;
          auVar301._0_8_ = 0x7f8000007f800000;
          auVar301._12_4_ = 0x7f800000;
          auVar301._16_4_ = 0x7f800000;
          auVar301._20_4_ = 0x7f800000;
          auVar301._24_4_ = 0x7f800000;
          auVar301._28_4_ = 0x7f800000;
          auVar300 = vblendvps_avx(auVar301,auVar64,auVar17);
          auVar15 = vmaxps_avx(local_740,_local_b60);
          auVar71._4_4_ = auVar15._4_4_ * 1.9073486e-06;
          auVar71._0_4_ = auVar15._0_4_ * 1.9073486e-06;
          auVar71._8_4_ = auVar15._8_4_ * 1.9073486e-06;
          auVar71._12_4_ = auVar15._12_4_ * 1.9073486e-06;
          auVar71._16_4_ = auVar15._16_4_ * 1.9073486e-06;
          auVar71._20_4_ = auVar15._20_4_ * 1.9073486e-06;
          auVar71._24_4_ = auVar15._24_4_ * 1.9073486e-06;
          auVar71._28_4_ = auVar15._28_4_;
          auVar15 = vcmpps_avx(local_3c0,auVar71,1);
          auVar305._8_4_ = 0xff800000;
          auVar305._0_8_ = 0xff800000ff800000;
          auVar305._12_4_ = 0xff800000;
          auVar305._16_4_ = 0xff800000;
          auVar305._20_4_ = 0xff800000;
          auVar305._24_4_ = 0xff800000;
          auVar305._28_4_ = 0xff800000;
          auVar304 = vblendvps_avx(auVar305,auVar65,auVar17);
          auVar124 = auVar17 & auVar15;
          if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar124 >> 0x7f,0) != '\0') ||
                (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar124 >> 0xbf,0) != '\0') ||
              (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar124[0x1f] < '\0') {
            auVar187 = vandps_avx(auVar17,auVar15);
            auVar15 = vcmpps_avx(auVar129,ZEXT832(0) << 0x20,2);
            auVar250._8_4_ = 0xff800000;
            auVar250._0_8_ = 0xff800000ff800000;
            auVar250._12_4_ = 0xff800000;
            auVar250._16_4_ = 0xff800000;
            auVar250._20_4_ = 0xff800000;
            auVar250._24_4_ = 0xff800000;
            auVar250._28_4_ = 0xff800000;
            auVar312._8_4_ = 0x7f800000;
            auVar312._0_8_ = 0x7f8000007f800000;
            auVar312._12_4_ = 0x7f800000;
            auVar312._16_4_ = 0x7f800000;
            auVar312._20_4_ = 0x7f800000;
            auVar312._24_4_ = 0x7f800000;
            auVar312._28_4_ = 0x7f800000;
            auVar129 = vblendvps_avx(auVar312,auVar250,auVar15);
            auVar271 = vpackssdw_avx(auVar187._0_16_,auVar187._16_16_);
            auVar124 = vpmovsxwd_avx2(auVar271);
            auVar300 = vblendvps_avx(auVar300,auVar129,auVar124);
            auVar230._8_4_ = 0x7f800000;
            auVar230._0_8_ = 0x7f8000007f800000;
            auVar230._12_4_ = 0x7f800000;
            auVar230._16_4_ = 0x7f800000;
            auVar230._20_4_ = 0x7f800000;
            auVar230._24_4_ = 0x7f800000;
            auVar230._28_4_ = 0x7f800000;
            auVar129 = vblendvps_avx(auVar250,auVar230,auVar15);
            auVar304 = vblendvps_avx(auVar304,auVar129,auVar124);
            auVar242._0_8_ = auVar187._0_8_ ^ 0xffffffffffffffff;
            auVar242._8_4_ = auVar187._8_4_ ^ 0xffffffff;
            auVar242._12_4_ = auVar187._12_4_ ^ 0xffffffff;
            auVar242._16_4_ = auVar187._16_4_ ^ 0xffffffff;
            auVar242._20_4_ = auVar187._20_4_ ^ 0xffffffff;
            auVar242._24_4_ = auVar187._24_4_ ^ 0xffffffff;
            auVar242._28_4_ = auVar187._28_4_ ^ 0xffffffff;
            auVar187 = vorps_avx(auVar15,auVar242);
            auVar187 = vandps_avx(auVar17,auVar187);
          }
          auVar311 = auVar16._0_28_;
        }
        auVar306 = ZEXT3264(auVar304);
        local_580 = local_a20;
        local_560 = vminps_avx(local_400,auVar300);
        _local_9a0 = vmaxps_avx(local_a20,auVar304);
        _local_420 = _local_9a0;
        auVar17 = vcmpps_avx(local_a20,local_560,2);
        local_7e0 = vandps_avx(auVar17,auVar125);
        auVar302 = ZEXT3264(local_7e0);
        auVar17 = vcmpps_avx(_local_9a0,local_400,2);
        local_9c0 = vandps_avx(auVar17,auVar125);
        auVar125 = vorps_avx(local_7e0,local_9c0);
        if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar125 >> 0x7f,0) != '\0') ||
              (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar125 >> 0xbf,0) != '\0') ||
            (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar125[0x1f] < '\0') {
          auVar72._4_4_ = auVar274._4_4_ * (float)local_8a0._4_4_;
          auVar72._0_4_ = auVar274._0_4_ * (float)local_8a0._0_4_;
          auVar72._8_4_ = auVar274._8_4_ * fStack_898;
          auVar72._12_4_ = auVar274._12_4_ * fStack_894;
          auVar72._16_4_ = auVar274._16_4_ * fStack_890;
          auVar72._20_4_ = auVar274._20_4_ * fStack_88c;
          auVar72._24_4_ = auVar274._24_4_ * fStack_888;
          auVar72._28_4_ = auVar125._28_4_;
          auVar271 = vfmadd213ps_fma(auVar261._0_32_,_local_880,auVar72);
          auVar261 = ZEXT1664(auVar271);
          auVar271 = vfmadd213ps_fma(auVar130,_local_980,ZEXT1632(auVar271));
          auVar209._0_8_ = auVar187._0_8_ ^ 0xffffffffffffffff;
          auVar209._8_4_ = auVar187._8_4_ ^ 0xffffffff;
          auVar209._12_4_ = auVar187._12_4_ ^ 0xffffffff;
          auVar209._16_4_ = auVar187._16_4_ ^ 0xffffffff;
          auVar209._20_4_ = auVar187._20_4_ ^ 0xffffffff;
          auVar209._24_4_ = auVar187._24_4_ ^ 0xffffffff;
          auVar209._28_4_ = auVar187._28_4_ ^ 0xffffffff;
          auVar243 = ZEXT3264(local_8c0);
          auVar125 = vandps_avx(ZEXT1632(auVar271),local_8c0);
          auVar248._8_4_ = 0x3e99999a;
          auVar248._0_8_ = 0x3e99999a3e99999a;
          auVar248._12_4_ = 0x3e99999a;
          auVar248._16_4_ = 0x3e99999a;
          auVar248._20_4_ = 0x3e99999a;
          auVar248._24_4_ = 0x3e99999a;
          auVar248._28_4_ = 0x3e99999a;
          auVar125 = vcmpps_avx(auVar125,auVar248,1);
          local_820 = vorps_avx(auVar125,auVar209);
          auVar185._0_4_ = (float)local_8a0._0_4_ * auVar311._0_4_;
          auVar185._4_4_ = (float)local_8a0._4_4_ * auVar311._4_4_;
          auVar185._8_4_ = fStack_898 * auVar311._8_4_;
          auVar185._12_4_ = fStack_894 * auVar311._12_4_;
          auVar185._16_4_ = fStack_890 * auVar311._16_4_;
          auVar185._20_4_ = fStack_88c * auVar311._20_4_;
          auVar185._24_4_ = fStack_888 * auVar311._24_4_;
          auVar185._28_4_ = 0;
          auVar271 = vfmadd213ps_fma(auVar159,_local_880,auVar185);
          auVar271 = vfmadd213ps_fma(auVar134,_local_980,ZEXT1632(auVar271));
          auVar125 = vandps_avx(ZEXT1632(auVar271),local_8c0);
          auVar125 = vcmpps_avx(auVar125,auVar248,1);
          auVar125 = vorps_avx(auVar125,auVar209);
          auVar161._8_4_ = 3;
          auVar161._0_8_ = 0x300000003;
          auVar161._12_4_ = 3;
          auVar161._16_4_ = 3;
          auVar161._20_4_ = 3;
          auVar161._24_4_ = 3;
          auVar161._28_4_ = 3;
          auVar186._8_4_ = 2;
          auVar186._0_8_ = 0x200000002;
          auVar186._12_4_ = 2;
          auVar186._16_4_ = 2;
          auVar186._20_4_ = 2;
          auVar186._24_4_ = 2;
          auVar186._28_4_ = 2;
          auVar125 = vblendvps_avx(auVar186,auVar161,auVar125);
          local_840._4_4_ = iVar99;
          local_840._0_4_ = iVar99;
          local_840._8_4_ = iVar99;
          local_840._12_4_ = iVar99;
          local_840._16_4_ = iVar99;
          local_840._20_4_ = iVar99;
          local_840._24_4_ = iVar99;
          local_840._28_4_ = iVar99;
          local_800 = vpcmpgtd_avx2(auVar125,local_840);
          local_5a0 = vpandn_avx2(local_800,local_7e0);
          local_9e0._4_4_ = local_a20._4_4_ + (float)local_a00._4_4_;
          local_9e0._0_4_ = local_a20._0_4_ + (float)local_a00._0_4_;
          fStack_9d8 = local_a20._8_4_ + fStack_9f8;
          fStack_9d4 = local_a20._12_4_ + fStack_9f4;
          fStack_9d0 = local_a20._16_4_ + fStack_9f0;
          fStack_9cc = local_a20._20_4_ + fStack_9ec;
          fStack_9c8 = local_a20._24_4_ + fStack_9e8;
          fStack_9c4 = local_a20._28_4_ + fStack_9e4;
          while( true ) {
            fStack_bdc = auVar5._4_4_;
            fStack_bd8 = auVar5._8_4_;
            fStack_bd4 = auVar5._12_4_;
            if ((((((((local_5a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_5a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_5a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_5a0 >> 0x7f,0) == '\0') &&
                  (local_5a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_5a0 >> 0xbf,0) == '\0') &&
                (local_5a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_5a0[0x1f]) break;
            auVar162._8_4_ = 0x7f800000;
            auVar162._0_8_ = 0x7f8000007f800000;
            auVar162._12_4_ = 0x7f800000;
            auVar162._16_4_ = 0x7f800000;
            auVar162._20_4_ = 0x7f800000;
            auVar162._24_4_ = 0x7f800000;
            auVar162._28_4_ = 0x7f800000;
            auVar125 = vblendvps_avx(auVar162,local_a20,local_5a0);
            auVar187 = vshufps_avx(auVar125,auVar125,0xb1);
            auVar187 = vminps_avx(auVar125,auVar187);
            auVar17 = vshufpd_avx(auVar187,auVar187,5);
            auVar187 = vminps_avx(auVar187,auVar17);
            auVar17 = vpermpd_avx2(auVar187,0x4e);
            auVar187 = vminps_avx(auVar187,auVar17);
            auVar187 = vcmpps_avx(auVar125,auVar187,0);
            auVar17 = local_5a0 & auVar187;
            auVar125 = local_5a0;
            if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar17 >> 0x7f,0) != '\0') ||
                  (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar17 >> 0xbf,0) != '\0') ||
                (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar17[0x1f] < '\0') {
              auVar125 = vandps_avx(auVar187,local_5a0);
            }
            uVar100 = vmovmskps_avx(auVar125);
            iVar20 = 0;
            for (; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x80000000) {
              iVar20 = iVar20 + 1;
            }
            uVar101 = iVar20 << 2;
            *(undefined4 *)(local_5a0 + uVar101) = 0;
            uVar100 = *(uint *)(local_1a0 + uVar101);
            uVar101 = *(uint *)(local_580 + uVar101);
            fVar211 = auVar2._0_4_;
            if ((float)local_ae0._0_4_ < 0.0) {
              auVar302 = ZEXT1664(auVar302._0_16_);
              auVar306 = ZEXT1664(auVar306._0_16_);
              fVar211 = sqrtf((float)local_ae0._0_4_);
            }
            auVar261 = ZEXT464(uVar101);
            auVar6 = vminps_avx(local_b40._0_16_,local_aa0._0_16_);
            auVar271 = vmaxps_avx(local_b40._0_16_,local_aa0._0_16_);
            auVar243 = ZEXT1664(auVar5);
            auVar7 = vminps_avx(auVar4,auVar5);
            auVar116 = vminps_avx(auVar6,auVar7);
            auVar6 = vmaxps_avx(auVar4,auVar5);
            auVar7 = vmaxps_avx(auVar271,auVar6);
            local_a80._8_4_ = NAN;
            local_a80._0_8_ = 0x7fffffff7fffffff;
            local_a80._12_4_ = NAN;
            auVar271 = vandps_avx(auVar116,local_a80._0_16_);
            auVar6 = vandps_avx(auVar7,local_a80._0_16_);
            auVar271 = vmaxps_avx(auVar271,auVar6);
            auVar6 = vmovshdup_avx(auVar271);
            auVar6 = vmaxss_avx(auVar6,auVar271);
            auVar271 = vshufpd_avx(auVar271,auVar271,1);
            auVar271 = vmaxss_avx(auVar271,auVar6);
            fVar232 = auVar271._0_4_ * 1.9073486e-06;
            local_900._0_4_ = fVar211 * 1.9073486e-06;
            local_960._0_16_ = vshufps_avx(auVar7,auVar7,0xff);
            auVar271 = vinsertps_avx(ZEXT416(uVar101),ZEXT416(uVar100),0x10);
            auVar281 = ZEXT1664(auVar271);
            lVar105 = 5;
            do {
              do {
                auVar271 = auVar281._0_16_;
                bVar108 = lVar105 == 0;
                lVar105 = lVar105 + -1;
                if (bVar108) goto LAB_013fecc7;
                auVar7 = vmovshdup_avx(auVar271);
                fVar264 = auVar7._0_4_;
                fVar251 = 1.0 - fVar264;
                fVar191 = fVar251 * fVar251 * fVar251;
                fVar234 = fVar264 * fVar264 * fVar264;
                auVar116 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar191),
                                           ZEXT416((uint)fVar234));
                fVar211 = fVar264 * fVar251;
                auVar308 = vfmadd231ss_fma(ZEXT416((uint)(fVar264 * fVar211 * 6.0)),
                                           ZEXT416((uint)(fVar251 * fVar211)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar295 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar211 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar264 * fVar211)));
                auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar234),
                                         ZEXT416((uint)fVar191));
                fVar233 = (auVar6._0_4_ + auVar295._0_4_) * 0.16666667;
                fVar234 = fVar234 * 0.16666667;
                auVar153._0_4_ = fVar234 * fVar168;
                auVar153._4_4_ = fVar234 * fStack_bdc;
                auVar153._8_4_ = fVar234 * fStack_bd8;
                auVar153._12_4_ = fVar234 * fStack_bd4;
                auVar193._4_4_ = fVar233;
                auVar193._0_4_ = fVar233;
                auVar193._8_4_ = fVar233;
                auVar193._12_4_ = fVar233;
                auVar6 = vfmadd132ps_fma(auVar193,auVar153,auVar4);
                fVar233 = (auVar116._0_4_ + auVar308._0_4_) * 0.16666667;
                auVar154._4_4_ = fVar233;
                auVar154._0_4_ = fVar233;
                auVar154._8_4_ = fVar233;
                auVar154._12_4_ = fVar233;
                auVar6 = vfmadd132ps_fma(auVar154,auVar6,local_aa0._0_16_);
                fVar234 = auVar281._0_4_;
                auVar171._4_4_ = fVar234;
                auVar171._0_4_ = fVar234;
                auVar171._8_4_ = fVar234;
                auVar171._12_4_ = fVar234;
                auVar116 = vfmadd213ps_fma(auVar171,local_ad0,_DAT_01f45a50);
                fVar191 = fVar191 * 0.16666667;
                auVar115._4_4_ = fVar191;
                auVar115._0_4_ = fVar191;
                auVar115._8_4_ = fVar191;
                auVar115._12_4_ = fVar191;
                auVar6 = vfmadd132ps_fma(auVar115,auVar6,local_b40._0_16_);
                local_8e0._0_16_ = auVar6;
                auVar6 = vsubps_avx(auVar116,auVar6);
                _local_b60 = auVar6;
                auVar6 = vdpps_avx(auVar6,auVar6,0x7f);
                fVar233 = auVar6._0_4_;
                if (fVar233 < 0.0) {
                  local_ba0._0_16_ = ZEXT416((uint)fVar251);
                  auVar167._0_4_ = sqrtf(fVar233);
                  auVar167._4_60_ = extraout_var;
                  auVar116 = auVar167._0_16_;
                  auVar308 = local_ba0._0_16_;
                }
                else {
                  auVar116 = vsqrtss_avx(auVar6,auVar6);
                  auVar308 = ZEXT416((uint)fVar251);
                }
                fVar191 = auVar308._0_4_;
                auVar117._4_4_ = fVar191;
                auVar117._0_4_ = fVar191;
                auVar117._8_4_ = fVar191;
                auVar117._12_4_ = fVar191;
                auVar265 = vfnmsub213ss_fma(auVar7,auVar7,ZEXT416((uint)(fVar211 * 4.0)));
                auVar295 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * 4.0)),auVar308,auVar308);
                fVar211 = fVar191 * -fVar191 * 0.5;
                fVar191 = auVar265._0_4_ * 0.5;
                fVar251 = auVar295._0_4_ * 0.5;
                fVar264 = fVar264 * fVar264 * 0.5;
                auVar236._0_4_ = fVar168 * fVar264;
                auVar236._4_4_ = fStack_bdc * fVar264;
                auVar236._8_4_ = fStack_bd8 * fVar264;
                auVar236._12_4_ = fStack_bd4 * fVar264;
                auVar194._4_4_ = fVar251;
                auVar194._0_4_ = fVar251;
                auVar194._8_4_ = fVar251;
                auVar194._12_4_ = fVar251;
                auVar295 = vfmadd213ps_fma(auVar194,auVar4,auVar236);
                auVar213._4_4_ = fVar191;
                auVar213._0_4_ = fVar191;
                auVar213._8_4_ = fVar191;
                auVar213._12_4_ = fVar191;
                auVar295 = vfmadd213ps_fma(auVar213,local_aa0._0_16_,auVar295);
                auVar288._4_4_ = fVar211;
                auVar288._0_4_ = fVar211;
                auVar288._8_4_ = fVar211;
                auVar288._12_4_ = fVar211;
                auVar265 = vfmadd213ps_fma(auVar288,local_b40._0_16_,auVar295);
                auVar295 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar308,auVar7);
                auVar308 = vfmadd213ss_fma(auVar7,SUB6416(ZEXT464(0xc0000000),0),auVar308);
                auVar7 = vshufps_avx(auVar271,auVar271,0x55);
                auVar195._0_4_ = fVar168 * auVar7._0_4_;
                auVar195._4_4_ = fStack_bdc * auVar7._4_4_;
                auVar195._8_4_ = fStack_bd8 * auVar7._8_4_;
                auVar195._12_4_ = fStack_bd4 * auVar7._12_4_;
                uVar110 = auVar308._0_4_;
                auVar214._4_4_ = uVar110;
                auVar214._0_4_ = uVar110;
                auVar214._8_4_ = uVar110;
                auVar214._12_4_ = uVar110;
                auVar7 = vfmadd213ps_fma(auVar214,auVar4,auVar195);
                auVar172._0_4_ = auVar295._0_4_;
                auVar172._4_4_ = auVar172._0_4_;
                auVar172._8_4_ = auVar172._0_4_;
                auVar172._12_4_ = auVar172._0_4_;
                auVar7 = vfmadd213ps_fma(auVar172,local_aa0._0_16_,auVar7);
                auVar113 = vfmadd231ps_fma(auVar7,local_b40._0_16_,auVar117);
                auVar308 = vdpps_avx(auVar265,auVar265,0x7f);
                auVar7 = vblendps_avx(auVar308,_DAT_01f45a50,0xe);
                auVar295 = vrsqrtss_avx(auVar7,auVar7);
                fVar211 = auVar295._0_4_;
                fVar251 = auVar308._0_4_;
                fVar211 = fVar211 * 1.5 + fVar251 * -0.5 * fVar211 * fVar211 * fVar211;
                auVar295 = vdpps_avx(auVar265,auVar113,0x7f);
                auVar173._0_4_ = auVar113._0_4_ * fVar251;
                auVar173._4_4_ = auVar113._4_4_ * fVar251;
                auVar173._8_4_ = auVar113._8_4_ * fVar251;
                auVar173._12_4_ = auVar113._12_4_ * fVar251;
                fVar191 = auVar295._0_4_;
                auVar237._0_4_ = auVar265._0_4_ * fVar191;
                auVar237._4_4_ = auVar265._4_4_ * fVar191;
                fVar264 = auVar265._8_4_;
                auVar237._8_4_ = fVar264 * fVar191;
                fVar252 = auVar265._12_4_;
                auVar237._12_4_ = fVar252 * fVar191;
                auVar295 = vsubps_avx(auVar173,auVar237);
                auVar7 = vrcpss_avx(auVar7,auVar7);
                auVar113 = vfnmadd213ss_fma(auVar7,auVar308,ZEXT416(0x40000000));
                fVar191 = auVar7._0_4_ * auVar113._0_4_;
                auVar7 = vmaxss_avx(ZEXT416((uint)fVar232),
                                    ZEXT416((uint)(fVar234 * (float)local_900._0_4_)));
                auVar167 = ZEXT1664(auVar7);
                auVar256._0_8_ = auVar265._0_8_ ^ 0x8000000080000000;
                auVar256._8_4_ = -fVar264;
                auVar256._12_4_ = -fVar252;
                auVar196._0_4_ = fVar211 * auVar295._0_4_ * fVar191;
                auVar196._4_4_ = fVar211 * auVar295._4_4_ * fVar191;
                auVar196._8_4_ = fVar211 * auVar295._8_4_ * fVar191;
                auVar196._12_4_ = fVar211 * auVar295._12_4_ * fVar191;
                auVar272._0_4_ = auVar265._0_4_ * fVar211;
                auVar272._4_4_ = auVar265._4_4_ * fVar211;
                auVar272._8_4_ = fVar264 * fVar211;
                auVar272._12_4_ = fVar252 * fVar211;
                local_ba0._0_4_ = auVar7._0_4_;
                if (fVar251 < -fVar251) {
                  local_b00._0_16_ = auVar272;
                  local_b20._0_16_ = auVar196;
                  fVar211 = sqrtf(fVar251);
                  auVar167 = ZEXT464((uint)local_ba0._0_4_);
                  auVar116 = ZEXT416(auVar116._0_4_);
                  auVar196 = local_b20._0_16_;
                  auVar272 = local_b00._0_16_;
                }
                else {
                  auVar7 = vsqrtss_avx(auVar308,auVar308);
                  fVar211 = auVar7._0_4_;
                }
                auVar7 = vdpps_avx(_local_b60,auVar272,0x7f);
                auVar152 = vfmadd213ss_fma(ZEXT416((uint)fVar232),auVar116,auVar167._0_16_);
                auVar308 = vdpps_avx(auVar256,auVar272,0x7f);
                auVar295 = vdpps_avx(_local_b60,auVar196,0x7f);
                auVar113 = vdpps_avx(local_ad0,auVar272,0x7f);
                auVar152 = vfmadd213ss_fma(ZEXT416((uint)(auVar116._0_4_ + 1.0)),
                                           ZEXT416((uint)(fVar232 / fVar211)),auVar152);
                auVar302 = ZEXT1664(auVar152);
                fVar211 = auVar308._0_4_ + auVar295._0_4_;
                auVar306 = ZEXT464((uint)fVar211);
                fVar191 = auVar7._0_4_;
                auVar118._0_4_ = fVar191 * fVar191;
                auVar118._4_4_ = auVar7._4_4_ * auVar7._4_4_;
                auVar118._8_4_ = auVar7._8_4_ * auVar7._8_4_;
                auVar118._12_4_ = auVar7._12_4_ * auVar7._12_4_;
                auVar116 = vdpps_avx(_local_b60,auVar256,0x7f);
                auVar295 = vsubps_avx(auVar6,auVar118);
                auVar308 = vrsqrtss_avx(auVar295,auVar295);
                fVar251 = auVar295._0_4_;
                fVar234 = auVar308._0_4_;
                fVar234 = fVar234 * 1.5 + fVar251 * -0.5 * fVar234 * fVar234 * fVar234;
                auVar308 = vdpps_avx(_local_b60,local_ad0,0x7f);
                auVar116 = vfnmadd231ss_fma(auVar116,auVar7,ZEXT416((uint)fVar211));
                auVar308 = vfnmadd231ss_fma(auVar308,auVar7,auVar113);
                if (fVar251 < 0.0) {
                  local_b00._0_16_ = ZEXT416((uint)fVar211);
                  local_b20._0_16_ = auVar113;
                  local_ac0._0_16_ = auVar116;
                  local_920._0_4_ = fVar234;
                  local_940._0_16_ = auVar308;
                  fVar211 = sqrtf(fVar251);
                  auVar306 = ZEXT1664(local_b00._0_16_);
                  auVar302 = ZEXT464(auVar152._0_4_);
                  auVar167 = ZEXT464((uint)local_ba0._0_4_);
                  fVar234 = (float)local_920._0_4_;
                  auVar308 = local_940._0_16_;
                  auVar113 = local_b20._0_16_;
                  auVar116 = local_ac0._0_16_;
                }
                else {
                  auVar295 = vsqrtss_avx(auVar295,auVar295);
                  fVar211 = auVar295._0_4_;
                }
                auVar261 = ZEXT1664(auVar265);
                auVar295 = vpermilps_avx(local_8e0._0_16_,0xff);
                fVar211 = fVar211 - auVar295._0_4_;
                auVar295 = vshufps_avx(auVar265,auVar265,0xff);
                auVar116 = vfmsub213ss_fma(auVar116,ZEXT416((uint)fVar234),auVar295);
                auVar197._0_8_ = auVar113._0_8_ ^ 0x8000000080000000;
                auVar197._8_4_ = auVar113._8_4_ ^ 0x80000000;
                auVar197._12_4_ = auVar113._12_4_ ^ 0x80000000;
                auVar215._0_8_ = auVar116._0_8_ ^ 0x8000000080000000;
                auVar215._8_4_ = auVar116._8_4_ ^ 0x80000000;
                auVar215._12_4_ = auVar116._12_4_ ^ 0x80000000;
                auVar152 = ZEXT416((uint)(auVar308._0_4_ * fVar234));
                auVar170 = auVar306._0_16_;
                auVar308 = vfmsub231ss_fma(ZEXT416((uint)(auVar113._0_4_ * auVar116._0_4_)),auVar170
                                           ,auVar152);
                auVar243 = ZEXT1664(auVar308);
                auVar116 = vinsertps_avx(auVar215,auVar152,0x1c);
                uVar110 = auVar308._0_4_;
                auVar216._4_4_ = uVar110;
                auVar216._0_4_ = uVar110;
                auVar216._8_4_ = uVar110;
                auVar216._12_4_ = uVar110;
                auVar116 = vdivps_avx(auVar116,auVar216);
                auVar308 = vinsertps_avx(auVar170,auVar197,0x10);
                auVar308 = vdivps_avx(auVar308,auVar216);
                auVar174._0_4_ = fVar191 * auVar116._0_4_ + fVar211 * auVar308._0_4_;
                auVar174._4_4_ = fVar191 * auVar116._4_4_ + fVar211 * auVar308._4_4_;
                auVar174._8_4_ = fVar191 * auVar116._8_4_ + fVar211 * auVar308._8_4_;
                auVar174._12_4_ = fVar191 * auVar116._12_4_ + fVar211 * auVar308._12_4_;
                auVar116 = vsubps_avx(auVar271,auVar174);
                auVar281 = ZEXT1664(auVar116);
                auVar271 = vandps_avx(auVar7,local_a80._0_16_);
              } while (auVar302._0_4_ <= auVar271._0_4_);
              auVar7 = vfmadd231ss_fma(ZEXT416((uint)(auVar167._0_4_ + auVar302._0_4_)),
                                       local_960._0_16_,ZEXT416(0x36000000));
              auVar271 = vandps_avx(ZEXT416((uint)fVar211),local_a80._0_16_);
            } while (auVar7._0_4_ <= auVar271._0_4_);
            fVar211 = auVar116._0_4_ + (float)local_a40._0_4_;
            if ((fVar109 <= fVar211) &&
               (fVar232 = *(float *)(ray + k * 4 + 0x100), fVar211 <= fVar232)) {
              auVar271 = vmovshdup_avx(auVar116);
              fVar234 = auVar271._0_4_;
              if ((0.0 <= fVar234) && (fVar234 <= 1.0)) {
                auVar6 = vrsqrtss_avx(auVar6,auVar6);
                fVar191 = auVar6._0_4_;
                auVar243 = ZEXT464((uint)(fVar233 * -0.5));
                pGVar9 = (context->scene->geometries).items[uVar104].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  fVar233 = fVar191 * 1.5 + fVar233 * -0.5 * fVar191 * fVar191 * fVar191;
                  auVar198._0_4_ = fVar233 * (float)local_b60._0_4_;
                  auVar198._4_4_ = fVar233 * (float)local_b60._4_4_;
                  auVar198._8_4_ = fVar233 * fStack_b58;
                  auVar198._12_4_ = fVar233 * fStack_b54;
                  auVar308 = vfmadd213ps_fma(auVar295,auVar198,auVar265);
                  auVar6 = vshufps_avx(auVar198,auVar198,0xc9);
                  auVar7 = vshufps_avx(auVar265,auVar265,0xc9);
                  auVar199._0_4_ = auVar198._0_4_ * auVar7._0_4_;
                  auVar199._4_4_ = auVar198._4_4_ * auVar7._4_4_;
                  auVar199._8_4_ = auVar198._8_4_ * auVar7._8_4_;
                  auVar199._12_4_ = auVar198._12_4_ * auVar7._12_4_;
                  auVar116 = vfmsub231ps_fma(auVar199,auVar265,auVar6);
                  auVar6 = vshufps_avx(auVar116,auVar116,0xc9);
                  auVar7 = vshufps_avx(auVar308,auVar308,0xc9);
                  auVar243 = ZEXT1664(auVar7);
                  auVar116 = vshufps_avx(auVar116,auVar116,0xd2);
                  auVar119._0_4_ = auVar308._0_4_ * auVar116._0_4_;
                  auVar119._4_4_ = auVar308._4_4_ * auVar116._4_4_;
                  auVar119._8_4_ = auVar308._8_4_ * auVar116._8_4_;
                  auVar119._12_4_ = auVar308._12_4_ * auVar116._12_4_;
                  auVar6 = vfmsub231ps_fma(auVar119,auVar6,auVar7);
                  uVar110 = auVar6._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar211;
                    uVar151 = vextractps_avx(auVar6,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar151;
                    uVar151 = vextractps_avx(auVar6,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar151;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar110;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar234;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(int *)(ray + k * 4 + 0x220) = (int)local_b68;
                    *(uint *)(ray + k * 4 + 0x240) = uVar104;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar13 = context->user;
                    local_4e0 = auVar271._0_8_;
                    auVar271 = vmovshdup_avx(auVar6);
                    local_540._8_8_ = auVar271._0_8_;
                    auVar271 = vshufps_avx(auVar6,auVar6,0xaa);
                    local_520 = auVar271._0_8_;
                    local_540._0_8_ = local_540._8_8_;
                    local_540._16_8_ = local_540._8_8_;
                    local_540._24_8_ = local_540._8_8_;
                    uStack_518 = local_520;
                    uStack_510 = local_520;
                    uStack_508 = local_520;
                    local_500 = uVar110;
                    uStack_4fc = uVar110;
                    uStack_4f8 = uVar110;
                    uStack_4f4 = uVar110;
                    uStack_4f0 = uVar110;
                    uStack_4ec = uVar110;
                    uStack_4e8 = uVar110;
                    uStack_4e4 = uVar110;
                    uStack_4d8 = local_4e0;
                    uStack_4d0 = local_4e0;
                    uStack_4c8 = local_4e0;
                    auVar175._12_4_ = 0;
                    auVar175._0_12_ = ZEXT812(0);
                    auVar175 = auVar175 << 0x20;
                    local_4c0 = ZEXT1232(ZEXT812(0)) << 0x20;
                    local_4a0 = CONCAT44(uStack_77c,local_780);
                    uStack_498 = CONCAT44(uStack_774,uStack_778);
                    uStack_490 = CONCAT44(uStack_76c,uStack_770);
                    uStack_488 = CONCAT44(uStack_764,uStack_768);
                    local_480._4_4_ = uStack_75c;
                    local_480._0_4_ = local_760;
                    local_480._8_4_ = uStack_758;
                    local_480._12_4_ = uStack_754;
                    local_480._16_4_ = uStack_750;
                    local_480._20_4_ = uStack_74c;
                    local_480._24_4_ = uStack_748;
                    local_480._28_4_ = uStack_744;
                    auVar125 = vpcmpeqd_avx2(local_480,local_480);
                    local_b70[1] = auVar125;
                    *local_b70 = auVar125;
                    local_460 = pRVar13->instID[0];
                    uStack_45c = local_460;
                    uStack_458 = local_460;
                    uStack_454 = local_460;
                    uStack_450 = local_460;
                    uStack_44c = local_460;
                    uStack_448 = local_460;
                    uStack_444 = local_460;
                    local_440 = pRVar13->instPrimID[0];
                    uStack_43c = local_440;
                    uStack_438 = local_440;
                    uStack_434 = local_440;
                    uStack_430 = local_440;
                    uStack_42c = local_440;
                    uStack_428 = local_440;
                    uStack_424 = local_440;
                    *(float *)(ray + k * 4 + 0x100) = fVar211;
                    local_a60 = local_7a0;
                    local_bd0.valid = (int *)local_a60;
                    local_bd0.geometryUserPtr = pGVar9->userPtr;
                    local_bd0.context = context->user;
                    local_bd0.hit = (RTCHitN *)local_540;
                    local_bd0.N = 8;
                    local_bd0.ray = (RTCRayN *)ray;
                    if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar243 = ZEXT1664(auVar7);
                      auVar261 = ZEXT1664(auVar265);
                      auVar302 = ZEXT1664(auVar302._0_16_);
                      auVar306 = ZEXT1664(auVar170);
                      (*pGVar9->intersectionFilterN)(&local_bd0);
                      auVar175 = ZEXT816(0) << 0x40;
                    }
                    auVar187 = ZEXT1632(auVar175);
                    auVar125 = vpcmpeqd_avx2(local_a60,auVar187);
                    auVar125 = _DAT_01f7b020 & ~auVar125;
                    if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar125 >> 0x7f,0) != '\0') ||
                          (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar125 >> 0xbf,0) != '\0') ||
                        (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar125[0x1f] < '\0') {
                      p_Var14 = context->args->filter;
                      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar243 = ZEXT1664(auVar243._0_16_);
                        auVar261 = ZEXT1664(auVar261._0_16_);
                        auVar302 = ZEXT1664(auVar302._0_16_);
                        auVar306 = ZEXT1664(auVar306._0_16_);
                        (*p_Var14)(&local_bd0);
                        auVar187 = ZEXT832(0) << 0x40;
                      }
                      auVar187 = vpcmpeqd_avx2(local_a60,auVar187);
                      auVar125 = _DAT_01f7b020 & ~auVar187;
                      if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar125 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar125 >> 0x7f,0) != '\0') ||
                            (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar125 >> 0xbf,0) != '\0') ||
                          (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar125[0x1f] < '\0') {
                        auVar138._0_8_ = auVar187._0_8_ ^ 0xffffffffffffffff;
                        auVar138._8_4_ = auVar187._8_4_ ^ 0xffffffff;
                        auVar138._12_4_ = auVar187._12_4_ ^ 0xffffffff;
                        auVar138._16_4_ = auVar187._16_4_ ^ 0xffffffff;
                        auVar138._20_4_ = auVar187._20_4_ ^ 0xffffffff;
                        auVar138._24_4_ = auVar187._24_4_ ^ 0xffffffff;
                        auVar138._28_4_ = auVar187._28_4_ ^ 0xffffffff;
                        auVar125 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])local_bd0.hit);
                        *(undefined1 (*) [32])(local_bd0.ray + 0x180) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x20));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1a0) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x40));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1c0) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x60));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1e0) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar138,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x80));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x200) = auVar125;
                        auVar125 = vpmaskmovd_avx2(auVar138,*(undefined1 (*) [32])
                                                             (local_bd0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x220) = auVar125;
                        auVar125 = vpmaskmovd_avx2(auVar138,*(undefined1 (*) [32])
                                                             (local_bd0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x240) = auVar125;
                        auVar125 = vpmaskmovd_avx2(auVar138,*(undefined1 (*) [32])
                                                             (local_bd0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x260) = auVar125;
                        auVar125 = vpmaskmovd_avx2(auVar138,*(undefined1 (*) [32])
                                                             (local_bd0.hit + 0x100));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x280) = auVar125;
                        goto LAB_013fecc7;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar232;
                  }
                }
              }
            }
LAB_013fecc7:
            uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar290._4_4_ = uVar110;
            auVar290._0_4_ = uVar110;
            auVar290._8_4_ = uVar110;
            auVar290._12_4_ = uVar110;
            auVar290._16_4_ = uVar110;
            auVar290._20_4_ = uVar110;
            auVar290._24_4_ = uVar110;
            auVar290._28_4_ = uVar110;
            auVar281 = ZEXT3264(auVar290);
            auVar125 = vcmpps_avx(_local_9e0,auVar290,2);
            local_5a0 = vandps_avx(auVar125,local_5a0);
          }
          auVar139._0_4_ = (float)local_a00._0_4_ + (float)local_9a0._0_4_;
          auVar139._4_4_ = (float)local_a00._4_4_ + (float)local_9a0._4_4_;
          auVar139._8_4_ = fStack_9f8 + fStack_998;
          auVar139._12_4_ = fStack_9f4 + fStack_994;
          auVar139._16_4_ = fStack_9f0 + fStack_990;
          auVar139._20_4_ = fStack_9ec + fStack_98c;
          auVar139._24_4_ = fStack_9e8 + fStack_988;
          auVar139._28_4_ = fStack_9e4 + fStack_984;
          uVar110 = auVar281._0_4_;
          auVar163._4_4_ = uVar110;
          auVar163._0_4_ = uVar110;
          auVar163._8_4_ = uVar110;
          auVar163._12_4_ = uVar110;
          auVar163._16_4_ = uVar110;
          auVar163._20_4_ = uVar110;
          auVar163._24_4_ = uVar110;
          auVar163._28_4_ = uVar110;
          auVar125 = vcmpps_avx(auVar139,auVar163,2);
          local_9c0 = vandps_avx(auVar125,local_9c0);
          auVar140._8_4_ = 3;
          auVar140._0_8_ = 0x300000003;
          auVar140._12_4_ = 3;
          auVar140._16_4_ = 3;
          auVar140._20_4_ = 3;
          auVar140._24_4_ = 3;
          auVar140._28_4_ = 3;
          auVar164._8_4_ = 2;
          auVar164._0_8_ = 0x200000002;
          auVar164._12_4_ = 2;
          auVar164._16_4_ = 2;
          auVar164._20_4_ = 2;
          auVar164._24_4_ = 2;
          auVar164._28_4_ = 2;
          auVar125 = vblendvps_avx(auVar164,auVar140,local_820);
          _local_9e0 = vpcmpgtd_avx2(auVar125,local_840);
          local_5c0 = vpandn_avx2(_local_9e0,local_9c0);
          local_a20 = _local_420;
          local_9a0._4_4_ = (float)local_a00._4_4_ + (float)local_420._4_4_;
          local_9a0._0_4_ = (float)local_a00._0_4_ + (float)local_420._0_4_;
          fStack_998 = fStack_9f8 + fStack_418;
          fStack_994 = fStack_9f4 + fStack_414;
          fStack_990 = fStack_9f0 + fStack_410;
          fStack_98c = fStack_9ec + fStack_40c;
          fStack_988 = fStack_9e8 + fStack_408;
          fStack_984 = fStack_9e4 + fStack_404;
          while( true ) {
            if ((((((((local_5c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_5c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_5c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_5c0 >> 0x7f,0) == '\0') &&
                  (local_5c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_5c0 >> 0xbf,0) == '\0') &&
                (local_5c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_5c0[0x1f]) break;
            auVar165._8_4_ = 0x7f800000;
            auVar165._0_8_ = 0x7f8000007f800000;
            auVar165._12_4_ = 0x7f800000;
            auVar165._16_4_ = 0x7f800000;
            auVar165._20_4_ = 0x7f800000;
            auVar165._24_4_ = 0x7f800000;
            auVar165._28_4_ = 0x7f800000;
            auVar125 = vblendvps_avx(auVar165,local_a20,local_5c0);
            auVar187 = vshufps_avx(auVar125,auVar125,0xb1);
            auVar187 = vminps_avx(auVar125,auVar187);
            auVar17 = vshufpd_avx(auVar187,auVar187,5);
            auVar187 = vminps_avx(auVar187,auVar17);
            auVar17 = vpermpd_avx2(auVar187,0x4e);
            auVar187 = vminps_avx(auVar187,auVar17);
            auVar187 = vcmpps_avx(auVar125,auVar187,0);
            auVar17 = local_5c0 & auVar187;
            auVar125 = local_5c0;
            if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar17 >> 0x7f,0) != '\0') ||
                  (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar17 >> 0xbf,0) != '\0') ||
                (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar17[0x1f] < '\0') {
              auVar125 = vandps_avx(auVar187,local_5c0);
            }
            uVar100 = vmovmskps_avx(auVar125);
            iVar20 = 0;
            for (; (uVar100 & 1) == 0; uVar100 = uVar100 >> 1 | 0x80000000) {
              iVar20 = iVar20 + 1;
            }
            uVar101 = iVar20 << 2;
            *(undefined4 *)(local_5c0 + uVar101) = 0;
            uVar100 = *(uint *)(local_1c0 + uVar101);
            uVar101 = *(uint *)(local_400 + uVar101);
            fVar211 = auVar3._0_4_;
            if ((float)local_ae0._0_4_ < 0.0) {
              auVar302 = ZEXT1664(auVar302._0_16_);
              auVar306 = ZEXT1664(auVar306._0_16_);
              fVar211 = sqrtf((float)local_ae0._0_4_);
            }
            auVar261 = ZEXT464(uVar101);
            auVar6 = vminps_avx(local_b40._0_16_,local_aa0._0_16_);
            auVar271 = vmaxps_avx(local_b40._0_16_,local_aa0._0_16_);
            auVar243 = ZEXT1664(auVar5);
            auVar7 = vminps_avx(auVar4,auVar5);
            auVar116 = vminps_avx(auVar6,auVar7);
            auVar6 = vmaxps_avx(auVar4,auVar5);
            auVar7 = vmaxps_avx(auVar271,auVar6);
            local_a80._8_4_ = NAN;
            local_a80._0_8_ = 0x7fffffff7fffffff;
            local_a80._12_4_ = NAN;
            auVar271 = vandps_avx(auVar116,local_a80._0_16_);
            auVar6 = vandps_avx(auVar7,local_a80._0_16_);
            auVar271 = vmaxps_avx(auVar271,auVar6);
            auVar6 = vmovshdup_avx(auVar271);
            auVar6 = vmaxss_avx(auVar6,auVar271);
            auVar271 = vshufpd_avx(auVar271,auVar271,1);
            auVar271 = vmaxss_avx(auVar271,auVar6);
            fVar232 = auVar271._0_4_ * 1.9073486e-06;
            local_900._0_4_ = fVar211 * 1.9073486e-06;
            local_960._0_16_ = vshufps_avx(auVar7,auVar7,0xff);
            auVar271 = vinsertps_avx(ZEXT416(uVar101),ZEXT416(uVar100),0x10);
            auVar281 = ZEXT1664(auVar271);
            lVar105 = 5;
            do {
              do {
                auVar271 = auVar281._0_16_;
                bVar108 = lVar105 == 0;
                lVar105 = lVar105 + -1;
                if (bVar108) goto LAB_013ff7eb;
                auVar7 = vmovshdup_avx(auVar271);
                fVar264 = auVar7._0_4_;
                fVar251 = 1.0 - fVar264;
                fVar191 = fVar251 * fVar251 * fVar251;
                fVar234 = fVar264 * fVar264 * fVar264;
                auVar116 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar191),
                                           ZEXT416((uint)fVar234));
                fVar211 = fVar264 * fVar251;
                auVar308 = vfmadd231ss_fma(ZEXT416((uint)(fVar264 * fVar211 * 6.0)),
                                           ZEXT416((uint)(fVar251 * fVar211)),
                                           SUB6416(ZEXT464(0x41400000),0));
                auVar295 = vfmadd231ss_fma(ZEXT416((uint)(fVar251 * fVar211 * 6.0)),
                                           SUB6416(ZEXT464(0x41400000),0),
                                           ZEXT416((uint)(fVar264 * fVar211)));
                auVar6 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar234),
                                         ZEXT416((uint)fVar191));
                fVar233 = (auVar6._0_4_ + auVar295._0_4_) * 0.16666667;
                fVar234 = fVar234 * 0.16666667;
                auVar155._0_4_ = fVar234 * fVar168;
                auVar155._4_4_ = fVar234 * fStack_bdc;
                auVar155._8_4_ = fVar234 * fStack_bd8;
                auVar155._12_4_ = fVar234 * fStack_bd4;
                auVar200._4_4_ = fVar233;
                auVar200._0_4_ = fVar233;
                auVar200._8_4_ = fVar233;
                auVar200._12_4_ = fVar233;
                auVar6 = vfmadd132ps_fma(auVar200,auVar155,auVar4);
                fVar233 = (auVar116._0_4_ + auVar308._0_4_) * 0.16666667;
                auVar156._4_4_ = fVar233;
                auVar156._0_4_ = fVar233;
                auVar156._8_4_ = fVar233;
                auVar156._12_4_ = fVar233;
                auVar6 = vfmadd132ps_fma(auVar156,auVar6,local_aa0._0_16_);
                fVar234 = auVar281._0_4_;
                auVar176._4_4_ = fVar234;
                auVar176._0_4_ = fVar234;
                auVar176._8_4_ = fVar234;
                auVar176._12_4_ = fVar234;
                auVar116 = vfmadd213ps_fma(auVar176,local_ad0,_DAT_01f45a50);
                fVar191 = fVar191 * 0.16666667;
                auVar120._4_4_ = fVar191;
                auVar120._0_4_ = fVar191;
                auVar120._8_4_ = fVar191;
                auVar120._12_4_ = fVar191;
                auVar6 = vfmadd132ps_fma(auVar120,auVar6,local_b40._0_16_);
                local_8e0._0_16_ = auVar6;
                auVar6 = vsubps_avx(auVar116,auVar6);
                _local_b60 = auVar6;
                auVar6 = vdpps_avx(auVar6,auVar6,0x7f);
                fVar233 = auVar6._0_4_;
                if (fVar233 < 0.0) {
                  local_ba0._0_16_ = ZEXT416((uint)fVar251);
                  auVar281._0_4_ = sqrtf(fVar233);
                  auVar281._4_60_ = extraout_var_00;
                  auVar116 = auVar281._0_16_;
                  auVar308 = local_ba0._0_16_;
                }
                else {
                  auVar116 = vsqrtss_avx(auVar6,auVar6);
                  auVar308 = ZEXT416((uint)fVar251);
                }
                fVar191 = auVar308._0_4_;
                auVar121._4_4_ = fVar191;
                auVar121._0_4_ = fVar191;
                auVar121._8_4_ = fVar191;
                auVar121._12_4_ = fVar191;
                auVar265 = vfnmsub213ss_fma(auVar7,auVar7,ZEXT416((uint)(fVar211 * 4.0)));
                auVar295 = vfmadd231ss_fma(ZEXT416((uint)(fVar211 * 4.0)),auVar308,auVar308);
                fVar211 = fVar191 * -fVar191 * 0.5;
                fVar191 = auVar265._0_4_ * 0.5;
                fVar251 = auVar295._0_4_ * 0.5;
                fVar264 = fVar264 * fVar264 * 0.5;
                auVar238._0_4_ = fVar168 * fVar264;
                auVar238._4_4_ = fStack_bdc * fVar264;
                auVar238._8_4_ = fStack_bd8 * fVar264;
                auVar238._12_4_ = fStack_bd4 * fVar264;
                auVar201._4_4_ = fVar251;
                auVar201._0_4_ = fVar251;
                auVar201._8_4_ = fVar251;
                auVar201._12_4_ = fVar251;
                auVar295 = vfmadd213ps_fma(auVar201,auVar4,auVar238);
                auVar217._4_4_ = fVar191;
                auVar217._0_4_ = fVar191;
                auVar217._8_4_ = fVar191;
                auVar217._12_4_ = fVar191;
                auVar295 = vfmadd213ps_fma(auVar217,local_aa0._0_16_,auVar295);
                auVar289._4_4_ = fVar211;
                auVar289._0_4_ = fVar211;
                auVar289._8_4_ = fVar211;
                auVar289._12_4_ = fVar211;
                auVar265 = vfmadd213ps_fma(auVar289,local_b40._0_16_,auVar295);
                auVar295 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar308,auVar7);
                auVar308 = vfmadd213ss_fma(auVar7,SUB6416(ZEXT464(0xc0000000),0),auVar308);
                auVar7 = vshufps_avx(auVar271,auVar271,0x55);
                auVar202._0_4_ = fVar168 * auVar7._0_4_;
                auVar202._4_4_ = fStack_bdc * auVar7._4_4_;
                auVar202._8_4_ = fStack_bd8 * auVar7._8_4_;
                auVar202._12_4_ = fStack_bd4 * auVar7._12_4_;
                uVar110 = auVar308._0_4_;
                auVar218._4_4_ = uVar110;
                auVar218._0_4_ = uVar110;
                auVar218._8_4_ = uVar110;
                auVar218._12_4_ = uVar110;
                auVar7 = vfmadd213ps_fma(auVar218,auVar4,auVar202);
                auVar177._0_4_ = auVar295._0_4_;
                auVar177._4_4_ = auVar177._0_4_;
                auVar177._8_4_ = auVar177._0_4_;
                auVar177._12_4_ = auVar177._0_4_;
                auVar7 = vfmadd213ps_fma(auVar177,local_aa0._0_16_,auVar7);
                auVar113 = vfmadd231ps_fma(auVar7,local_b40._0_16_,auVar121);
                auVar308 = vdpps_avx(auVar265,auVar265,0x7f);
                auVar7 = vblendps_avx(auVar308,_DAT_01f45a50,0xe);
                auVar295 = vrsqrtss_avx(auVar7,auVar7);
                fVar211 = auVar295._0_4_;
                fVar251 = auVar308._0_4_;
                fVar211 = fVar211 * 1.5 + fVar251 * -0.5 * fVar211 * fVar211 * fVar211;
                auVar295 = vdpps_avx(auVar265,auVar113,0x7f);
                auVar178._0_4_ = auVar113._0_4_ * fVar251;
                auVar178._4_4_ = auVar113._4_4_ * fVar251;
                auVar178._8_4_ = auVar113._8_4_ * fVar251;
                auVar178._12_4_ = auVar113._12_4_ * fVar251;
                fVar191 = auVar295._0_4_;
                auVar239._0_4_ = auVar265._0_4_ * fVar191;
                auVar239._4_4_ = auVar265._4_4_ * fVar191;
                fVar264 = auVar265._8_4_;
                auVar239._8_4_ = fVar264 * fVar191;
                fVar252 = auVar265._12_4_;
                auVar239._12_4_ = fVar252 * fVar191;
                auVar295 = vsubps_avx(auVar178,auVar239);
                auVar7 = vrcpss_avx(auVar7,auVar7);
                auVar113 = vfnmadd213ss_fma(auVar7,auVar308,ZEXT416(0x40000000));
                fVar191 = auVar7._0_4_ * auVar113._0_4_;
                auVar7 = vmaxss_avx(ZEXT416((uint)fVar232),
                                    ZEXT416((uint)(fVar234 * (float)local_900._0_4_)));
                auVar167 = ZEXT1664(auVar7);
                auVar257._0_8_ = auVar265._0_8_ ^ 0x8000000080000000;
                auVar257._8_4_ = -fVar264;
                auVar257._12_4_ = -fVar252;
                auVar203._0_4_ = fVar211 * auVar295._0_4_ * fVar191;
                auVar203._4_4_ = fVar211 * auVar295._4_4_ * fVar191;
                auVar203._8_4_ = fVar211 * auVar295._8_4_ * fVar191;
                auVar203._12_4_ = fVar211 * auVar295._12_4_ * fVar191;
                auVar273._0_4_ = auVar265._0_4_ * fVar211;
                auVar273._4_4_ = auVar265._4_4_ * fVar211;
                auVar273._8_4_ = fVar264 * fVar211;
                auVar273._12_4_ = fVar252 * fVar211;
                local_ba0._0_4_ = auVar7._0_4_;
                if (fVar251 < -fVar251) {
                  local_b00._0_16_ = auVar273;
                  local_b20._0_16_ = auVar203;
                  fVar211 = sqrtf(fVar251);
                  auVar167 = ZEXT464((uint)local_ba0._0_4_);
                  auVar116 = ZEXT416(auVar116._0_4_);
                  auVar203 = local_b20._0_16_;
                  auVar273 = local_b00._0_16_;
                }
                else {
                  auVar7 = vsqrtss_avx(auVar308,auVar308);
                  fVar211 = auVar7._0_4_;
                }
                auVar7 = vdpps_avx(_local_b60,auVar273,0x7f);
                auVar152 = vfmadd213ss_fma(ZEXT416((uint)fVar232),auVar116,auVar167._0_16_);
                auVar308 = vdpps_avx(auVar257,auVar273,0x7f);
                auVar295 = vdpps_avx(_local_b60,auVar203,0x7f);
                auVar113 = vdpps_avx(local_ad0,auVar273,0x7f);
                auVar152 = vfmadd213ss_fma(ZEXT416((uint)(auVar116._0_4_ + 1.0)),
                                           ZEXT416((uint)(fVar232 / fVar211)),auVar152);
                auVar302 = ZEXT1664(auVar152);
                fVar211 = auVar308._0_4_ + auVar295._0_4_;
                auVar306 = ZEXT464((uint)fVar211);
                fVar191 = auVar7._0_4_;
                auVar122._0_4_ = fVar191 * fVar191;
                auVar122._4_4_ = auVar7._4_4_ * auVar7._4_4_;
                auVar122._8_4_ = auVar7._8_4_ * auVar7._8_4_;
                auVar122._12_4_ = auVar7._12_4_ * auVar7._12_4_;
                auVar116 = vdpps_avx(_local_b60,auVar257,0x7f);
                auVar295 = vsubps_avx(auVar6,auVar122);
                auVar308 = vrsqrtss_avx(auVar295,auVar295);
                fVar251 = auVar295._0_4_;
                fVar234 = auVar308._0_4_;
                fVar234 = fVar234 * 1.5 + fVar251 * -0.5 * fVar234 * fVar234 * fVar234;
                auVar308 = vdpps_avx(_local_b60,local_ad0,0x7f);
                auVar116 = vfnmadd231ss_fma(auVar116,auVar7,ZEXT416((uint)fVar211));
                auVar308 = vfnmadd231ss_fma(auVar308,auVar7,auVar113);
                if (fVar251 < 0.0) {
                  local_b00._0_16_ = ZEXT416((uint)fVar211);
                  local_b20._0_16_ = auVar113;
                  local_ac0._0_16_ = auVar116;
                  local_920._0_4_ = fVar234;
                  local_940._0_16_ = auVar308;
                  fVar211 = sqrtf(fVar251);
                  auVar306 = ZEXT1664(local_b00._0_16_);
                  auVar302 = ZEXT464(auVar152._0_4_);
                  auVar167 = ZEXT464((uint)local_ba0._0_4_);
                  fVar234 = (float)local_920._0_4_;
                  auVar308 = local_940._0_16_;
                  auVar113 = local_b20._0_16_;
                  auVar116 = local_ac0._0_16_;
                }
                else {
                  auVar295 = vsqrtss_avx(auVar295,auVar295);
                  fVar211 = auVar295._0_4_;
                }
                auVar261 = ZEXT1664(auVar265);
                auVar295 = vpermilps_avx(local_8e0._0_16_,0xff);
                fVar211 = fVar211 - auVar295._0_4_;
                auVar295 = vshufps_avx(auVar265,auVar265,0xff);
                auVar116 = vfmsub213ss_fma(auVar116,ZEXT416((uint)fVar234),auVar295);
                auVar204._0_8_ = auVar113._0_8_ ^ 0x8000000080000000;
                auVar204._8_4_ = auVar113._8_4_ ^ 0x80000000;
                auVar204._12_4_ = auVar113._12_4_ ^ 0x80000000;
                auVar219._0_8_ = auVar116._0_8_ ^ 0x8000000080000000;
                auVar219._8_4_ = auVar116._8_4_ ^ 0x80000000;
                auVar219._12_4_ = auVar116._12_4_ ^ 0x80000000;
                auVar152 = ZEXT416((uint)(auVar308._0_4_ * fVar234));
                auVar170 = auVar306._0_16_;
                auVar308 = vfmsub231ss_fma(ZEXT416((uint)(auVar113._0_4_ * auVar116._0_4_)),auVar170
                                           ,auVar152);
                auVar243 = ZEXT1664(auVar308);
                auVar116 = vinsertps_avx(auVar219,auVar152,0x1c);
                uVar110 = auVar308._0_4_;
                auVar220._4_4_ = uVar110;
                auVar220._0_4_ = uVar110;
                auVar220._8_4_ = uVar110;
                auVar220._12_4_ = uVar110;
                auVar116 = vdivps_avx(auVar116,auVar220);
                auVar308 = vinsertps_avx(auVar170,auVar204,0x10);
                auVar308 = vdivps_avx(auVar308,auVar220);
                auVar179._0_4_ = fVar191 * auVar116._0_4_ + fVar211 * auVar308._0_4_;
                auVar179._4_4_ = fVar191 * auVar116._4_4_ + fVar211 * auVar308._4_4_;
                auVar179._8_4_ = fVar191 * auVar116._8_4_ + fVar211 * auVar308._8_4_;
                auVar179._12_4_ = fVar191 * auVar116._12_4_ + fVar211 * auVar308._12_4_;
                auVar116 = vsubps_avx(auVar271,auVar179);
                auVar281 = ZEXT1664(auVar116);
                auVar271 = vandps_avx(auVar7,local_a80._0_16_);
              } while (auVar302._0_4_ <= auVar271._0_4_);
              auVar7 = vfmadd231ss_fma(ZEXT416((uint)(auVar167._0_4_ + auVar302._0_4_)),
                                       local_960._0_16_,ZEXT416(0x36000000));
              auVar271 = vandps_avx(ZEXT416((uint)fVar211),local_a80._0_16_);
            } while (auVar7._0_4_ <= auVar271._0_4_);
            fVar211 = auVar116._0_4_ + (float)local_a40._0_4_;
            if ((fVar109 <= fVar211) &&
               (fVar232 = *(float *)(ray + k * 4 + 0x100), fVar211 <= fVar232)) {
              auVar271 = vmovshdup_avx(auVar116);
              fVar234 = auVar271._0_4_;
              if ((0.0 <= fVar234) && (fVar234 <= 1.0)) {
                auVar6 = vrsqrtss_avx(auVar6,auVar6);
                fVar191 = auVar6._0_4_;
                auVar243 = ZEXT464((uint)(fVar233 * -0.5));
                pGVar9 = (context->scene->geometries).items[uVar104].ptr;
                if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  fVar233 = fVar191 * 1.5 + fVar233 * -0.5 * fVar191 * fVar191 * fVar191;
                  auVar205._0_4_ = fVar233 * (float)local_b60._0_4_;
                  auVar205._4_4_ = fVar233 * (float)local_b60._4_4_;
                  auVar205._8_4_ = fVar233 * fStack_b58;
                  auVar205._12_4_ = fVar233 * fStack_b54;
                  auVar308 = vfmadd213ps_fma(auVar295,auVar205,auVar265);
                  auVar6 = vshufps_avx(auVar205,auVar205,0xc9);
                  auVar7 = vshufps_avx(auVar265,auVar265,0xc9);
                  auVar206._0_4_ = auVar205._0_4_ * auVar7._0_4_;
                  auVar206._4_4_ = auVar205._4_4_ * auVar7._4_4_;
                  auVar206._8_4_ = auVar205._8_4_ * auVar7._8_4_;
                  auVar206._12_4_ = auVar205._12_4_ * auVar7._12_4_;
                  auVar116 = vfmsub231ps_fma(auVar206,auVar265,auVar6);
                  auVar6 = vshufps_avx(auVar116,auVar116,0xc9);
                  auVar7 = vshufps_avx(auVar308,auVar308,0xc9);
                  auVar243 = ZEXT1664(auVar7);
                  auVar116 = vshufps_avx(auVar116,auVar116,0xd2);
                  auVar123._0_4_ = auVar308._0_4_ * auVar116._0_4_;
                  auVar123._4_4_ = auVar308._4_4_ * auVar116._4_4_;
                  auVar123._8_4_ = auVar308._8_4_ * auVar116._8_4_;
                  auVar123._12_4_ = auVar308._12_4_ * auVar116._12_4_;
                  auVar6 = vfmsub231ps_fma(auVar123,auVar6,auVar7);
                  uVar110 = auVar6._0_4_;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    *(float *)(ray + k * 4 + 0x100) = fVar211;
                    uVar151 = vextractps_avx(auVar6,1);
                    *(undefined4 *)(ray + k * 4 + 0x180) = uVar151;
                    uVar151 = vextractps_avx(auVar6,2);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar151;
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar110;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar234;
                    *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                    *(int *)(ray + k * 4 + 0x220) = (int)local_b68;
                    *(uint *)(ray + k * 4 + 0x240) = uVar104;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    pRVar13 = context->user;
                    local_4e0 = auVar271._0_8_;
                    auVar271 = vmovshdup_avx(auVar6);
                    local_540._8_8_ = auVar271._0_8_;
                    auVar271 = vshufps_avx(auVar6,auVar6,0xaa);
                    local_520 = auVar271._0_8_;
                    local_540._0_8_ = local_540._8_8_;
                    local_540._16_8_ = local_540._8_8_;
                    local_540._24_8_ = local_540._8_8_;
                    uStack_518 = local_520;
                    uStack_510 = local_520;
                    uStack_508 = local_520;
                    local_500 = uVar110;
                    uStack_4fc = uVar110;
                    uStack_4f8 = uVar110;
                    uStack_4f4 = uVar110;
                    uStack_4f0 = uVar110;
                    uStack_4ec = uVar110;
                    uStack_4e8 = uVar110;
                    uStack_4e4 = uVar110;
                    uStack_4d8 = local_4e0;
                    uStack_4d0 = local_4e0;
                    uStack_4c8 = local_4e0;
                    auVar180._12_4_ = 0;
                    auVar180._0_12_ = ZEXT812(0);
                    auVar180 = auVar180 << 0x20;
                    local_4c0 = ZEXT1232(ZEXT812(0)) << 0x20;
                    local_4a0 = CONCAT44(uStack_77c,local_780);
                    uStack_498 = CONCAT44(uStack_774,uStack_778);
                    uStack_490 = CONCAT44(uStack_76c,uStack_770);
                    uStack_488 = CONCAT44(uStack_764,uStack_768);
                    local_480._4_4_ = uStack_75c;
                    local_480._0_4_ = local_760;
                    local_480._8_4_ = uStack_758;
                    local_480._12_4_ = uStack_754;
                    local_480._16_4_ = uStack_750;
                    local_480._20_4_ = uStack_74c;
                    local_480._24_4_ = uStack_748;
                    local_480._28_4_ = uStack_744;
                    auVar125 = vpcmpeqd_avx2(local_480,local_480);
                    local_b70[1] = auVar125;
                    *local_b70 = auVar125;
                    local_460 = pRVar13->instID[0];
                    uStack_45c = local_460;
                    uStack_458 = local_460;
                    uStack_454 = local_460;
                    uStack_450 = local_460;
                    uStack_44c = local_460;
                    uStack_448 = local_460;
                    uStack_444 = local_460;
                    local_440 = pRVar13->instPrimID[0];
                    uStack_43c = local_440;
                    uStack_438 = local_440;
                    uStack_434 = local_440;
                    uStack_430 = local_440;
                    uStack_42c = local_440;
                    uStack_428 = local_440;
                    uStack_424 = local_440;
                    *(float *)(ray + k * 4 + 0x100) = fVar211;
                    local_a60 = local_7a0;
                    local_bd0.valid = (int *)local_a60;
                    local_bd0.geometryUserPtr = pGVar9->userPtr;
                    local_bd0.context = context->user;
                    local_bd0.hit = (RTCHitN *)local_540;
                    local_bd0.N = 8;
                    local_bd0.ray = (RTCRayN *)ray;
                    if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar243 = ZEXT1664(auVar7);
                      auVar261 = ZEXT1664(auVar265);
                      auVar302 = ZEXT1664(auVar302._0_16_);
                      auVar306 = ZEXT1664(auVar170);
                      (*pGVar9->intersectionFilterN)(&local_bd0);
                      auVar180 = ZEXT816(0) << 0x40;
                    }
                    auVar187 = ZEXT1632(auVar180);
                    auVar125 = vpcmpeqd_avx2(local_a60,auVar187);
                    auVar125 = _DAT_01f7b020 & ~auVar125;
                    if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar125 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar125 >> 0x7f,0) != '\0') ||
                          (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar125 >> 0xbf,0) != '\0') ||
                        (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar125[0x1f] < '\0') {
                      p_Var14 = context->args->filter;
                      if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar243 = ZEXT1664(auVar243._0_16_);
                        auVar261 = ZEXT1664(auVar261._0_16_);
                        auVar302 = ZEXT1664(auVar302._0_16_);
                        auVar306 = ZEXT1664(auVar306._0_16_);
                        (*p_Var14)(&local_bd0);
                        auVar187 = ZEXT832(0) << 0x40;
                      }
                      auVar187 = vpcmpeqd_avx2(local_a60,auVar187);
                      auVar125 = _DAT_01f7b020 & ~auVar187;
                      if ((((((((auVar125 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar125 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar125 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar125 >> 0x7f,0) != '\0') ||
                            (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar125 >> 0xbf,0) != '\0') ||
                          (auVar125 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar125[0x1f] < '\0') {
                        auVar141._0_8_ = auVar187._0_8_ ^ 0xffffffffffffffff;
                        auVar141._8_4_ = auVar187._8_4_ ^ 0xffffffff;
                        auVar141._12_4_ = auVar187._12_4_ ^ 0xffffffff;
                        auVar141._16_4_ = auVar187._16_4_ ^ 0xffffffff;
                        auVar141._20_4_ = auVar187._20_4_ ^ 0xffffffff;
                        auVar141._24_4_ = auVar187._24_4_ ^ 0xffffffff;
                        auVar141._28_4_ = auVar187._28_4_ ^ 0xffffffff;
                        auVar125 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])local_bd0.hit);
                        *(undefined1 (*) [32])(local_bd0.ray + 0x180) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x20));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1a0) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x40));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1c0) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x60));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x1e0) = auVar125;
                        auVar125 = vmaskmovps_avx(auVar141,*(undefined1 (*) [32])
                                                            (local_bd0.hit + 0x80));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x200) = auVar125;
                        auVar125 = vpmaskmovd_avx2(auVar141,*(undefined1 (*) [32])
                                                             (local_bd0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x220) = auVar125;
                        auVar125 = vpmaskmovd_avx2(auVar141,*(undefined1 (*) [32])
                                                             (local_bd0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x240) = auVar125;
                        auVar125 = vpmaskmovd_avx2(auVar141,*(undefined1 (*) [32])
                                                             (local_bd0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x260) = auVar125;
                        auVar125 = vpmaskmovd_avx2(auVar141,*(undefined1 (*) [32])
                                                             (local_bd0.hit + 0x100));
                        *(undefined1 (*) [32])(local_bd0.ray + 0x280) = auVar125;
                        goto LAB_013ff7eb;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar232;
                  }
                }
              }
            }
LAB_013ff7eb:
            uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar291._4_4_ = uVar110;
            auVar291._0_4_ = uVar110;
            auVar291._8_4_ = uVar110;
            auVar291._12_4_ = uVar110;
            auVar291._16_4_ = uVar110;
            auVar291._20_4_ = uVar110;
            auVar291._24_4_ = uVar110;
            auVar291._28_4_ = uVar110;
            auVar281 = ZEXT3264(auVar291);
            auVar125 = vcmpps_avx(_local_9a0,auVar291,2);
            local_5c0 = vandps_avx(auVar125,local_5c0);
          }
          auVar166._0_4_ = local_a00._0_4_ + local_580._0_4_;
          auVar166._4_4_ = local_a00._4_4_ + local_580._4_4_;
          auVar166._8_4_ = local_a00._8_4_ + local_580._8_4_;
          auVar166._12_4_ = local_a00._12_4_ + local_580._12_4_;
          auVar166._16_4_ = local_a00._16_4_ + local_580._16_4_;
          auVar166._20_4_ = local_a00._20_4_ + local_580._20_4_;
          auVar166._24_4_ = local_a00._24_4_ + local_580._24_4_;
          auVar166._28_4_ = local_a00._28_4_ + local_580._28_4_;
          uVar110 = auVar281._0_4_;
          auVar210._4_4_ = uVar110;
          auVar210._0_4_ = uVar110;
          auVar210._8_4_ = uVar110;
          auVar210._12_4_ = uVar110;
          auVar210._16_4_ = uVar110;
          auVar210._20_4_ = uVar110;
          auVar210._24_4_ = uVar110;
          auVar210._28_4_ = uVar110;
          auVar292 = ZEXT3264(_local_a00);
          auVar187 = vcmpps_avx(auVar166,auVar210,2);
          auVar125 = vandps_avx(local_800,local_7e0);
          auVar125 = vandps_avx(auVar187,auVar125);
          auVar229._0_4_ = local_a00._0_4_ + local_420._0_4_;
          auVar229._4_4_ = local_a00._4_4_ + local_420._4_4_;
          auVar229._8_4_ = local_a00._8_4_ + local_420._8_4_;
          auVar229._12_4_ = local_a00._12_4_ + local_420._12_4_;
          auVar229._16_4_ = local_a00._16_4_ + local_420._16_4_;
          auVar229._20_4_ = local_a00._20_4_ + local_420._20_4_;
          auVar229._24_4_ = local_a00._24_4_ + local_420._24_4_;
          auVar229._28_4_ = local_a00._28_4_ + local_420._28_4_;
          auVar17 = vcmpps_avx(auVar229,auVar210,2);
          auVar187 = vandps_avx(_local_9e0,local_9c0);
          auVar187 = vandps_avx(auVar17,auVar187);
          auVar187 = vorps_avx(auVar125,auVar187);
          if ((((((((auVar187 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar187 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar187 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar187 >> 0x7f,0) != '\0') ||
                (auVar187 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar187 >> 0xbf,0) != '\0') ||
              (auVar187 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar187[0x1f] < '\0') {
            uVar103 = (ulong)uVar107;
            *(undefined1 (*) [32])(auStack_180 + uVar103 * 0x60) = auVar187;
            auVar125 = vblendvps_avx(_local_420,local_580,auVar125);
            *(undefined1 (*) [32])(auStack_160 + uVar103 * 0x60) = auVar125;
            uVar102 = vmovlps_avx(local_7b0);
            (&uStack_140)[uVar103 * 0xc] = uVar102;
            aiStack_138[uVar103 * 0x18] = iVar99 + 1;
            uVar107 = uVar107 + 1;
          }
          auVar231 = ZEXT3264(CONCAT428(0x3f800000,
                                        CONCAT424(0x3f800000,
                                                  CONCAT420(0x3f800000,
                                                            CONCAT416(0x3f800000,
                                                                      CONCAT412(0x3f800000,
                                                                                CONCAT48(0x3f800000,
                                                                                                                                                                                  
                                                  0x3f8000003f800000)))))));
          auVar281 = ZEXT3264(_DAT_01f7b040);
          goto LAB_013fe2c8;
        }
        auVar228._8_4_ = 0x3f800000;
        auVar228._0_8_ = 0x3f8000003f800000;
        auVar228._12_4_ = 0x3f800000;
        auVar228._16_4_ = 0x3f800000;
        auVar228._20_4_ = 0x3f800000;
        auVar228._24_4_ = 0x3f800000;
        auVar228._28_4_ = 0x3f800000;
        auVar15 = _local_8a0;
      }
      auVar243 = ZEXT3264(auVar15);
      auVar231 = ZEXT3264(auVar228);
      auVar281 = ZEXT3264(_DAT_01f7b040);
      auVar292 = ZEXT3264(_local_a00);
    }
LAB_013fe2c8:
    do {
      uVar100 = uVar107;
      if (uVar100 == 0) {
        uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar144._4_4_ = uVar110;
        auVar144._0_4_ = uVar110;
        auVar144._8_4_ = uVar110;
        auVar144._12_4_ = uVar110;
        auVar144._16_4_ = uVar110;
        auVar144._20_4_ = uVar110;
        auVar144._24_4_ = uVar110;
        auVar144._28_4_ = uVar110;
        auVar125 = vcmpps_avx(local_360,auVar144,2);
        uVar104 = vmovmskps_avx(auVar125);
        uVar104 = uVar104 & (uint)local_a28 - 1 & (uint)local_a28;
        goto LAB_013fd2c6;
      }
      uVar102 = (ulong)(uVar100 - 1);
      lVar105 = uVar102 * 0x60;
      auVar125 = *(undefined1 (*) [32])(auStack_160 + lVar105);
      auVar136._0_4_ = auVar292._0_4_ + auVar125._0_4_;
      auVar136._4_4_ = auVar292._4_4_ + auVar125._4_4_;
      auVar136._8_4_ = auVar292._8_4_ + auVar125._8_4_;
      auVar136._12_4_ = auVar292._12_4_ + auVar125._12_4_;
      auVar136._16_4_ = auVar292._16_4_ + auVar125._16_4_;
      auVar136._20_4_ = auVar292._20_4_ + auVar125._20_4_;
      auVar136._24_4_ = auVar292._24_4_ + auVar125._24_4_;
      auVar136._28_4_ = auVar292._28_4_ + auVar125._28_4_;
      uVar110 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar208._4_4_ = uVar110;
      auVar208._0_4_ = uVar110;
      auVar208._8_4_ = uVar110;
      auVar208._12_4_ = uVar110;
      auVar208._16_4_ = uVar110;
      auVar208._20_4_ = uVar110;
      auVar208._24_4_ = uVar110;
      auVar208._28_4_ = uVar110;
      auVar17 = vcmpps_avx(auVar136,auVar208,2);
      auVar187 = vandps_avx(auVar17,*(undefined1 (*) [32])(auStack_180 + lVar105));
      local_540 = auVar187;
      auVar17 = *(undefined1 (*) [32])(auStack_180 + lVar105) & auVar17;
      uVar107 = uVar100 - 1;
    } while ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                  (auVar17 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar17 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                SUB321(auVar17 >> 0x7f,0) == '\0') &&
               (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              SUB321(auVar17 >> 0xbf,0) == '\0') &&
             (auVar17 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             -1 < auVar17[0x1f]);
    auVar184._8_4_ = 0x7f800000;
    auVar184._0_8_ = 0x7f8000007f800000;
    auVar184._12_4_ = 0x7f800000;
    auVar184._16_4_ = 0x7f800000;
    auVar184._20_4_ = 0x7f800000;
    auVar184._24_4_ = 0x7f800000;
    auVar184._28_4_ = 0x7f800000;
    auVar125 = vblendvps_avx(auVar184,auVar125,auVar187);
    auVar17 = vshufps_avx(auVar125,auVar125,0xb1);
    auVar17 = vminps_avx(auVar125,auVar17);
    auVar129 = vshufpd_avx(auVar17,auVar17,5);
    auVar17 = vminps_avx(auVar17,auVar129);
    auVar129 = vpermpd_avx2(auVar17,0x4e);
    auVar17 = vminps_avx(auVar17,auVar129);
    auVar125 = vcmpps_avx(auVar125,auVar17,0);
    auVar17 = auVar187 & auVar125;
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0x7f,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0xbf,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0')
    {
      auVar187 = vandps_avx(auVar125,auVar187);
    }
    uVar107 = vmovmskps_avx(auVar187);
    iVar20 = 0;
    for (; (uVar107 & 1) == 0; uVar107 = uVar107 >> 1 | 0x80000000) {
      iVar20 = iVar20 + 1;
    }
    *(undefined4 *)(local_540 + (uint)(iVar20 << 2)) = 0;
    uVar103 = (&uStack_140)[uVar102 * 0xc];
    auVar114._8_8_ = 0;
    auVar114._0_8_ = uVar103;
    iVar99 = aiStack_138[uVar102 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar105) = local_540;
    uVar107 = uVar100 - 1;
    if ((((((((local_540 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_540 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_540 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_540 >> 0x7f,0) != '\0') ||
          (local_540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_540 >> 0xbf,0) != '\0') ||
        (local_540 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_540[0x1f] < '\0') {
      uVar107 = uVar100;
    }
    uVar110 = (undefined4)uVar103;
    auVar160._4_4_ = uVar110;
    auVar160._0_4_ = uVar110;
    auVar160._8_4_ = uVar110;
    auVar160._12_4_ = uVar110;
    auVar160._16_4_ = uVar110;
    auVar160._20_4_ = uVar110;
    auVar160._24_4_ = uVar110;
    auVar160._28_4_ = uVar110;
    auVar271 = vmovshdup_avx(auVar114);
    auVar271 = vsubps_avx(auVar271,auVar114);
    auVar137._0_4_ = auVar271._0_4_;
    auVar137._4_4_ = auVar137._0_4_;
    auVar137._8_4_ = auVar137._0_4_;
    auVar137._12_4_ = auVar137._0_4_;
    auVar137._16_4_ = auVar137._0_4_;
    auVar137._20_4_ = auVar137._0_4_;
    auVar137._24_4_ = auVar137._0_4_;
    auVar137._28_4_ = auVar137._0_4_;
    auVar271 = vfmadd132ps_fma(auVar137,auVar160,auVar281._0_32_);
    local_580 = ZEXT1632(auVar271);
    auVar167 = ZEXT864(*(ulong *)(local_580 + (uint)(iVar20 << 2)));
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }